

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined8 uVar1;
  Primitive PVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  ulong uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  uint uVar85;
  undefined1 (*pauVar86) [32];
  uint uVar87;
  uint uVar88;
  long lVar89;
  ulong uVar90;
  ulong uVar91;
  int iVar92;
  ulong uVar93;
  float fVar94;
  float fVar96;
  float fVar128;
  vint4 bi_2;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined4 uVar95;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar111 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar112 [16];
  undefined1 auVar127 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar147 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 extraout_var_01 [56];
  undefined1 auVar153 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  vint4 ai_2;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar193;
  vint4 ai;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar206;
  float fVar207;
  float fVar208;
  undefined1 auVar202 [32];
  float fVar209;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar210;
  float fVar220;
  float fVar221;
  vint4 bi;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  float fVar226;
  float fVar230;
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [64];
  float fVar231;
  float fVar240;
  float fVar241;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar242;
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar243;
  float fVar244;
  undefined1 auVar239 [64];
  float fVar245;
  float fVar260;
  float fVar261;
  vint4 ai_1;
  float fVar262;
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar256 [32];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [64];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar275;
  float fVar276;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar277;
  undefined1 auVar273 [32];
  undefined1 auVar278 [16];
  float fVar284;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  float s;
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  float fVar291;
  undefined1 auVar290 [64];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [32];
  float fVar295;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  undefined1 auVar296 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_c08;
  uint uStack_b64;
  float local_b40;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  RTCFilterFunctionNArguments local_ab0;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 (*local_9e8) [16];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined4 uStack_9d0;
  undefined4 uStack_9cc;
  undefined4 uStack_9c8;
  undefined4 uStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  ulong local_960;
  undefined1 auStack_958 [24];
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  Primitive *local_8c8;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined4 local_860;
  undefined4 uStack_85c;
  undefined4 uStack_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined4 uStack_848;
  undefined4 uStack_844;
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  uint uStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [16];
  undefined1 auStack_7b0 [16];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  uint local_740;
  uint uStack_73c;
  uint uStack_738;
  uint uStack_734;
  uint local_730;
  uint uStack_72c;
  uint uStack_728;
  uint uStack_724;
  RTCHitN local_720 [16];
  undefined1 auStack_710 [16];
  undefined4 local_700;
  undefined4 uStack_6fc;
  undefined4 uStack_6f8;
  undefined4 uStack_6f4;
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [16];
  uint local_6b0;
  uint uStack_6ac;
  uint uStack_6a8;
  uint uStack_6a4;
  uint uStack_6a0;
  uint uStack_69c;
  uint uStack_698;
  uint uStack_694;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [32];
  undefined4 local_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar152 [64];
  undefined1 auVar154 [64];
  undefined1 auVar274 [64];
  undefined1 auVar283 [64];
  
  PVar2 = prim[1];
  uVar91 = (ulong)(byte)PVar2;
  fVar94 = *(float *)(prim + uVar91 * 0x19 + 0x12);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar7 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar6 = vsubps_avx(auVar6,*(undefined1 (*) [16])(prim + uVar91 * 0x19 + 6));
  auVar97._0_4_ = fVar94 * auVar6._0_4_;
  auVar97._4_4_ = fVar94 * auVar6._4_4_;
  auVar97._8_4_ = fVar94 * auVar6._8_4_;
  auVar97._12_4_ = fVar94 * auVar6._12_4_;
  auVar211._0_4_ = fVar94 * auVar7._0_4_;
  auVar211._4_4_ = fVar94 * auVar7._4_4_;
  auVar211._8_4_ = fVar94 * auVar7._8_4_;
  auVar211._12_4_ = fVar94 * auVar7._12_4_;
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 4 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 5 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 6 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar91 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  uVar93 = (ulong)(uint)((int)(uVar91 * 9) * 2);
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + uVar91 + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  uVar93 = (ulong)(uint)((int)(uVar91 * 5) << 2);
  auVar155 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar155 = vcvtdq2ps_avx(auVar155);
  auVar290 = ZEXT1664(auVar155);
  auVar292._4_4_ = auVar211._0_4_;
  auVar292._0_4_ = auVar211._0_4_;
  auVar292._8_4_ = auVar211._0_4_;
  auVar292._12_4_ = auVar211._0_4_;
  auVar107 = vshufps_avx(auVar211,auVar211,0x55);
  auVar98 = vshufps_avx(auVar211,auVar211,0xaa);
  fVar94 = auVar98._0_4_;
  auVar271._0_4_ = fVar94 * auVar9._0_4_;
  fVar128 = auVar98._4_4_;
  auVar271._4_4_ = fVar128 * auVar9._4_4_;
  fVar193 = auVar98._8_4_;
  auVar271._8_4_ = fVar193 * auVar9._8_4_;
  fVar96 = auVar98._12_4_;
  auVar271._12_4_ = fVar96 * auVar9._12_4_;
  auVar267._0_4_ = auVar12._0_4_ * fVar94;
  auVar267._4_4_ = auVar12._4_4_ * fVar128;
  auVar267._8_4_ = auVar12._8_4_ * fVar193;
  auVar267._12_4_ = auVar12._12_4_ * fVar96;
  auVar246._0_4_ = auVar155._0_4_ * fVar94;
  auVar246._4_4_ = auVar155._4_4_ * fVar128;
  auVar246._8_4_ = auVar155._8_4_ * fVar193;
  auVar246._12_4_ = auVar155._12_4_ * fVar96;
  auVar98 = vfmadd231ps_fma(auVar271,auVar107,auVar7);
  auVar130 = vfmadd231ps_fma(auVar267,auVar107,auVar11);
  auVar107 = vfmadd231ps_fma(auVar246,auVar99,auVar107);
  auVar165 = vfmadd231ps_fma(auVar98,auVar292,auVar6);
  auVar130 = vfmadd231ps_fma(auVar130,auVar292,auVar10);
  auVar195 = vfmadd231ps_fma(auVar107,auVar100,auVar292);
  auVar293._4_4_ = auVar97._0_4_;
  auVar293._0_4_ = auVar97._0_4_;
  auVar293._8_4_ = auVar97._0_4_;
  auVar293._12_4_ = auVar97._0_4_;
  auVar107 = vshufps_avx(auVar97,auVar97,0x55);
  auVar98 = vshufps_avx(auVar97,auVar97,0xaa);
  fVar94 = auVar98._0_4_;
  auVar212._0_4_ = fVar94 * auVar9._0_4_;
  fVar128 = auVar98._4_4_;
  auVar212._4_4_ = fVar128 * auVar9._4_4_;
  fVar193 = auVar98._8_4_;
  auVar212._8_4_ = fVar193 * auVar9._8_4_;
  fVar96 = auVar98._12_4_;
  auVar212._12_4_ = fVar96 * auVar9._12_4_;
  auVar129._0_4_ = auVar12._0_4_ * fVar94;
  auVar129._4_4_ = auVar12._4_4_ * fVar128;
  auVar129._8_4_ = auVar12._8_4_ * fVar193;
  auVar129._12_4_ = auVar12._12_4_ * fVar96;
  auVar98._0_4_ = auVar155._0_4_ * fVar94;
  auVar98._4_4_ = auVar155._4_4_ * fVar128;
  auVar98._8_4_ = auVar155._8_4_ * fVar193;
  auVar98._12_4_ = auVar155._12_4_ * fVar96;
  auVar7 = vfmadd231ps_fma(auVar212,auVar107,auVar7);
  auVar9 = vfmadd231ps_fma(auVar129,auVar107,auVar11);
  auVar11 = vfmadd231ps_fma(auVar98,auVar107,auVar99);
  auVar12 = vfmadd231ps_fma(auVar7,auVar293,auVar6);
  auVar99 = vfmadd231ps_fma(auVar9,auVar293,auVar10);
  auVar155 = vfmadd231ps_fma(auVar11,auVar293,auVar100);
  auVar232._8_4_ = 0x7fffffff;
  auVar232._0_8_ = 0x7fffffff7fffffff;
  auVar232._12_4_ = 0x7fffffff;
  auVar6 = vandps_avx(auVar165,auVar232);
  auVar194._8_4_ = 0x219392ef;
  auVar194._0_8_ = 0x219392ef219392ef;
  auVar194._12_4_ = 0x219392ef;
  auVar6 = vcmpps_avx(auVar6,auVar194,1);
  auVar7 = vblendvps_avx(auVar165,auVar194,auVar6);
  auVar6 = vandps_avx(auVar130,auVar232);
  auVar6 = vcmpps_avx(auVar6,auVar194,1);
  auVar9 = vblendvps_avx(auVar130,auVar194,auVar6);
  auVar6 = vandps_avx(auVar195,auVar232);
  auVar6 = vcmpps_avx(auVar6,auVar194,1);
  auVar6 = vblendvps_avx(auVar195,auVar194,auVar6);
  auVar10 = vrcpps_avx(auVar7);
  auVar233._8_4_ = 0x3f800000;
  auVar233._0_8_ = 0x3f8000003f800000;
  auVar233._12_4_ = 0x3f800000;
  auVar7 = vfnmadd213ps_fma(auVar7,auVar10,auVar233);
  auVar10 = vfmadd132ps_fma(auVar7,auVar10,auVar10);
  auVar7 = vrcpps_avx(auVar9);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar7,auVar233);
  auVar11 = vfmadd132ps_fma(auVar9,auVar7,auVar7);
  auVar7 = vrcpps_avx(auVar6);
  auVar6 = vfnmadd213ps_fma(auVar6,auVar7,auVar233);
  auVar100 = vfmadd132ps_fma(auVar6,auVar7,auVar7);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar91 * 7 + 6);
  auVar6 = vpmovsxwd_avx(auVar6);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar6 = vsubps_avx(auVar6,auVar12);
  auVar195._0_4_ = auVar10._0_4_ * auVar6._0_4_;
  auVar195._4_4_ = auVar10._4_4_ * auVar6._4_4_;
  auVar195._8_4_ = auVar10._8_4_ * auVar6._8_4_;
  auVar195._12_4_ = auVar10._12_4_ * auVar6._12_4_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar91 * 9 + 6);
  auVar6 = vpmovsxwd_avx(auVar7);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar6 = vsubps_avx(auVar6,auVar12);
  auVar213._0_4_ = auVar10._0_4_ * auVar6._0_4_;
  auVar213._4_4_ = auVar10._4_4_ * auVar6._4_4_;
  auVar213._8_4_ = auVar10._8_4_ * auVar6._8_4_;
  auVar213._12_4_ = auVar10._12_4_ * auVar6._12_4_;
  auVar130._1_3_ = 0;
  auVar130[0] = PVar2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar7 = vpmovsxwd_avx(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar91 * -2 + 6);
  auVar6 = vpmovsxwd_avx(auVar10);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar6 = vsubps_avx(auVar6,auVar99);
  auVar247._0_4_ = auVar6._0_4_ * auVar11._0_4_;
  auVar247._4_4_ = auVar6._4_4_ * auVar11._4_4_;
  auVar247._8_4_ = auVar6._8_4_ * auVar11._8_4_;
  auVar247._12_4_ = auVar6._12_4_ * auVar11._12_4_;
  auVar6 = vcvtdq2ps_avx(auVar7);
  auVar6 = vsubps_avx(auVar6,auVar99);
  auVar107._0_4_ = auVar11._0_4_ * auVar6._0_4_;
  auVar107._4_4_ = auVar11._4_4_ * auVar6._4_4_;
  auVar107._8_4_ = auVar11._8_4_ * auVar6._8_4_;
  auVar107._12_4_ = auVar11._12_4_ * auVar6._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar93 + uVar91 + 6);
  auVar6 = vpmovsxwd_avx(auVar11);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar6 = vsubps_avx(auVar6,auVar155);
  auVar165._0_4_ = auVar100._0_4_ * auVar6._0_4_;
  auVar165._4_4_ = auVar100._4_4_ * auVar6._4_4_;
  auVar165._8_4_ = auVar100._8_4_ * auVar6._8_4_;
  auVar165._12_4_ = auVar100._12_4_ * auVar6._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar91 * 0x17 + 6);
  auVar6 = vpmovsxwd_avx(auVar12);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar6 = vsubps_avx(auVar6,auVar155);
  auVar99._0_4_ = auVar100._0_4_ * auVar6._0_4_;
  auVar99._4_4_ = auVar100._4_4_ * auVar6._4_4_;
  auVar99._8_4_ = auVar100._8_4_ * auVar6._8_4_;
  auVar99._12_4_ = auVar100._12_4_ * auVar6._12_4_;
  auVar6 = vpminsd_avx(auVar195,auVar213);
  auVar7 = vpminsd_avx(auVar247,auVar107);
  auVar6 = vmaxps_avx(auVar6,auVar7);
  auVar7 = vpminsd_avx(auVar165,auVar99);
  uVar95 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar263._4_4_ = uVar95;
  auVar263._0_4_ = uVar95;
  auVar263._8_4_ = uVar95;
  auVar263._12_4_ = uVar95;
  auVar7 = vmaxps_avx(auVar7,auVar263);
  auVar6 = vmaxps_avx(auVar6,auVar7);
  local_580._0_4_ = auVar6._0_4_ * 0.99999964;
  local_580._4_4_ = auVar6._4_4_ * 0.99999964;
  local_580._8_4_ = auVar6._8_4_ * 0.99999964;
  local_580._12_4_ = auVar6._12_4_ * 0.99999964;
  auVar6 = vpmaxsd_avx(auVar195,auVar213);
  auVar7 = vpmaxsd_avx(auVar247,auVar107);
  auVar6 = vminps_avx(auVar6,auVar7);
  auVar7 = vpmaxsd_avx(auVar165,auVar99);
  uVar95 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar155._4_4_ = uVar95;
  auVar155._0_4_ = uVar95;
  auVar155._8_4_ = uVar95;
  auVar155._12_4_ = uVar95;
  auVar7 = vminps_avx(auVar7,auVar155);
  auVar6 = vminps_avx(auVar6,auVar7);
  auVar100._0_4_ = auVar6._0_4_ * 1.0000004;
  auVar100._4_4_ = auVar6._4_4_ * 1.0000004;
  auVar100._8_4_ = auVar6._8_4_ * 1.0000004;
  auVar100._12_4_ = auVar6._12_4_ * 1.0000004;
  auVar130[4] = PVar2;
  auVar130._5_3_ = 0;
  auVar130[8] = PVar2;
  auVar130._9_3_ = 0;
  auVar130[0xc] = PVar2;
  auVar130._13_3_ = 0;
  auVar7 = vpcmpgtd_avx(auVar130,_DAT_01f7fcf0);
  auVar6 = vcmpps_avx(local_580,auVar100,2);
  auVar6 = vandps_avx(auVar6,auVar7);
  uVar85 = vmovmskps_avx(auVar6);
  if (uVar85 == 0) {
    return;
  }
  uVar85 = uVar85 & 0xff;
  auVar114._16_16_ = mm_lookupmask_ps._240_16_;
  auVar114._0_16_ = mm_lookupmask_ps._240_16_;
  local_260 = vblendps_avx(auVar114,ZEXT832(0) << 0x20,0x80);
  local_9e8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_860 = 0x7fffffff;
  uStack_85c = 0x7fffffff;
  uStack_858 = 0x7fffffff;
  uStack_854 = 0x7fffffff;
  uStack_850 = 0x7fffffff;
  uStack_84c = 0x7fffffff;
  uStack_848 = 0x7fffffff;
  uStack_844 = 0x7fffffff;
  local_840 = 0x80000000;
  uStack_83c = 0x80000000;
  uStack_838 = 0x80000000;
  uStack_834 = 0x80000000;
  fStack_830 = -0.0;
  fStack_82c = -0.0;
  fStack_828 = -0.0;
  uStack_824 = 0x80000000;
  local_8c8 = prim;
LAB_01607b3e:
  lVar89 = 0;
  uVar91 = (ulong)uVar85;
  for (uVar93 = uVar91; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
    lVar89 = lVar89 + 1;
  }
  uVar85 = *(uint *)(local_8c8 + 2);
  local_740 = *(uint *)(local_8c8 + lVar89 * 4 + 6);
  local_960 = (ulong)local_740;
  pGVar4 = (context->scene->geometries).items[uVar85].ptr;
  uVar93 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_960);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar89 = *(long *)&pGVar4[1].time_range.upper;
  auVar6 = *(undefined1 (*) [16])(lVar89 + (long)p_Var5 * uVar93);
  auVar7 = *(undefined1 (*) [16])(lVar89 + (uVar93 + 1) * (long)p_Var5);
  uVar91 = uVar91 - 1 & uVar91;
  if (uVar91 != 0) {
    uVar90 = uVar91 - 1 & uVar91;
    for (uVar18 = uVar91; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
    }
    if (uVar90 != 0) {
      for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar10 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar95 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar272._4_4_ = uVar95;
  auVar272._0_4_ = uVar95;
  auVar272._8_4_ = uVar95;
  auVar272._12_4_ = uVar95;
  fStack_7f0 = (float)uVar95;
  _local_800 = auVar272;
  fStack_7ec = (float)uVar95;
  fStack_7e8 = (float)uVar95;
  register0x000014dc = uVar95;
  auVar274 = ZEXT3264(_local_800);
  uVar95 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar278._4_4_ = uVar95;
  auVar278._0_4_ = uVar95;
  auVar278._8_4_ = uVar95;
  auVar278._12_4_ = uVar95;
  fStack_7d0 = (float)uVar95;
  _local_7e0 = auVar278;
  fStack_7cc = (float)uVar95;
  fStack_7c8 = (float)uVar95;
  register0x0000151c = uVar95;
  auVar283 = ZEXT3264(_local_7e0);
  auVar9 = vunpcklps_avx(auVar272,auVar278);
  fVar94 = *(float *)(ray + k * 4 + 0x60);
  auVar268._4_4_ = fVar94;
  auVar268._0_4_ = fVar94;
  auVar268._8_4_ = fVar94;
  auVar268._12_4_ = fVar94;
  local_a60._16_4_ = fVar94;
  local_a60._0_16_ = auVar268;
  local_a60._20_4_ = fVar94;
  local_a60._24_4_ = fVar94;
  local_a60._28_4_ = fVar94;
  local_990 = vinsertps_avx(auVar9,auVar268,0x28);
  auVar259 = ZEXT1664(local_990);
  auVar214._0_4_ = (auVar6._0_4_ + auVar7._0_4_) * 0.5;
  auVar214._4_4_ = (auVar6._4_4_ + auVar7._4_4_) * 0.5;
  auVar214._8_4_ = (auVar6._8_4_ + auVar7._8_4_) * 0.5;
  auVar214._12_4_ = (auVar6._12_4_ + auVar7._12_4_) * 0.5;
  auVar9 = vsubps_avx(auVar214,auVar10);
  auVar9 = vdpps_avx(auVar9,local_990,0x7f);
  local_9a0 = vdpps_avx(local_990,local_990,0x7f);
  auVar266 = ZEXT1664(local_9a0);
  auVar11 = vrcpss_avx(local_9a0,local_9a0);
  auVar12 = vfnmadd213ss_fma(auVar11,local_9a0,ZEXT416(0x40000000));
  local_2a0 = auVar9._0_4_ * auVar11._0_4_ * auVar12._0_4_;
  auVar227._4_4_ = local_2a0;
  auVar227._0_4_ = local_2a0;
  auVar227._8_4_ = local_2a0;
  auVar227._12_4_ = local_2a0;
  fStack_930 = local_2a0;
  _local_940 = auVar227;
  fStack_92c = local_2a0;
  fStack_928 = local_2a0;
  fStack_924 = local_2a0;
  auVar9 = vfmadd231ps_fma(auVar10,local_990,auVar227);
  auVar9 = vblendps_avx(auVar9,_DAT_01f7aa10,8);
  auVar10 = vsubps_avx(auVar6,auVar9);
  auVar11 = vsubps_avx(*(undefined1 (*) [16])(lVar89 + (uVar93 + 2) * (long)p_Var5),auVar9);
  auVar12 = vsubps_avx(auVar7,auVar9);
  auVar9 = vsubps_avx(*(undefined1 (*) [16])(lVar89 + (uVar93 + 3) * (long)p_Var5),auVar9);
  auVar6 = vmovshdup_avx(auVar10);
  local_1e0 = auVar6._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar6 = vshufps_avx(auVar10,auVar10,0xaa);
  local_3c0 = auVar6._0_8_;
  uStack_3b8 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3a8 = local_3c0;
  auVar6 = vshufps_avx(auVar10,auVar10,0xff);
  local_200 = auVar6._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar6 = vmovshdup_avx(auVar12);
  local_3e0 = auVar6._0_8_;
  uStack_3d8 = local_3e0;
  uStack_3d0 = local_3e0;
  uStack_3c8 = local_3e0;
  auVar6 = vshufps_avx(auVar12,auVar12,0xaa);
  local_400 = auVar6._0_8_;
  uStack_3f8 = local_400;
  uStack_3f0 = local_400;
  uStack_3e8 = local_400;
  auVar6 = vshufps_avx(auVar12,auVar12,0xff);
  local_420 = auVar6._0_8_;
  uStack_418 = local_420;
  uStack_410 = local_420;
  uStack_408 = local_420;
  auVar6 = vmovshdup_avx(auVar11);
  local_440 = auVar6._0_8_;
  uStack_438 = local_440;
  uStack_430 = local_440;
  uStack_428 = local_440;
  auVar6 = vshufps_avx(auVar11,auVar11,0xaa);
  local_460 = auVar6._0_8_;
  uStack_458 = local_460;
  uStack_450 = local_460;
  uStack_448 = local_460;
  auVar6 = vshufps_avx(auVar11,auVar11,0xff);
  local_480 = auVar6._0_8_;
  uStack_478 = local_480;
  uStack_470 = local_480;
  uStack_468 = local_480;
  auVar6 = vmovshdup_avx(auVar9);
  local_4a0 = auVar6._0_8_;
  uStack_498 = local_4a0;
  uStack_490 = local_4a0;
  uStack_488 = local_4a0;
  auVar6 = vshufps_avx(auVar9,auVar9,0xaa);
  local_4c0 = auVar6._0_8_;
  uStack_4b8 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4a8 = local_4c0;
  auVar6 = vshufps_avx(auVar9,auVar9,0xff);
  local_4e0 = auVar6._0_8_;
  uStack_4d8 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4c8 = local_4e0;
  auVar6 = vfmadd231ps_fma(ZEXT432((uint)(fVar94 * fVar94)),_local_7e0,_local_7e0);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),_local_800,_local_800);
  uVar95 = auVar6._0_4_;
  local_220._4_4_ = uVar95;
  local_220._0_4_ = uVar95;
  local_220._8_4_ = uVar95;
  local_220._12_4_ = uVar95;
  local_220._16_4_ = uVar95;
  local_220._20_4_ = uVar95;
  local_220._24_4_ = uVar95;
  local_220._28_4_ = uVar95;
  auVar239 = ZEXT3264(local_220);
  fVar94 = *(float *)(ray + k * 4 + 0x30);
  local_8f0 = ZEXT416((uint)local_2a0);
  local_2a0 = fVar94 - local_2a0;
  fStack_29c = local_2a0;
  fStack_298 = local_2a0;
  fStack_294 = local_2a0;
  fStack_290 = local_2a0;
  fStack_28c = local_2a0;
  fStack_288 = local_2a0;
  fStack_284 = local_2a0;
  local_c08 = 1;
  uVar93 = 0;
  local_500 = auVar10._0_4_;
  uStack_4fc = local_500;
  uStack_4f8 = local_500;
  uStack_4f4 = local_500;
  uStack_4f0 = local_500;
  uStack_4ec = local_500;
  uStack_4e8 = local_500;
  uStack_4e4 = local_500;
  local_520 = auVar12._0_4_;
  uStack_51c = local_520;
  uStack_518 = local_520;
  uStack_514 = local_520;
  uStack_510 = local_520;
  uStack_50c = local_520;
  uStack_508 = local_520;
  uStack_504 = local_520;
  local_540 = auVar11._0_4_;
  uStack_53c = local_540;
  uStack_538 = local_540;
  uStack_534 = local_540;
  uStack_530 = local_540;
  uStack_52c = local_540;
  uStack_528 = local_540;
  uStack_524 = local_540;
  fVar128 = auVar9._0_4_;
  auVar147._4_4_ = uStack_85c;
  auVar147._0_4_ = local_860;
  auVar147._8_4_ = uStack_858;
  auVar147._12_4_ = uStack_854;
  auVar147._16_4_ = uStack_850;
  auVar147._20_4_ = uStack_84c;
  auVar147._24_4_ = uStack_848;
  auVar147._28_4_ = uStack_844;
  local_560 = vandps_avx(local_220,auVar147);
  auVar6 = vsqrtss_avx(local_9a0,local_9a0);
  auVar7 = vsqrtss_avx(local_9a0,local_9a0);
  auVar229 = ZEXT1664(ZEXT816(0x3f80000000000000));
  local_280 = fVar128;
  fStack_27c = fVar128;
  fStack_278 = fVar128;
  fStack_274 = fVar128;
  fStack_270 = fVar128;
  fStack_26c = fVar128;
  fStack_268 = fVar128;
  fStack_264 = fVar128;
  uStack_73c = local_740;
  uStack_738 = local_740;
  uStack_734 = local_740;
  local_730 = uVar85;
  uStack_72c = uVar85;
  uStack_728 = uVar85;
  uStack_724 = uVar85;
  do {
    auVar202._8_4_ = 0x3f800000;
    auVar202._0_8_ = 0x3f8000003f800000;
    auVar202._12_4_ = 0x3f800000;
    auVar202._16_4_ = 0x3f800000;
    auVar202._20_4_ = 0x3f800000;
    iVar92 = (int)uVar93;
    auVar202._24_4_ = 0x3f800000;
    auVar202._28_4_ = 0x3f800000;
    local_570 = auVar229._0_16_;
    auVar100 = vmovshdup_avx(local_570);
    auVar100 = vsubps_avx(auVar100,local_570);
    auVar115._0_4_ = auVar100._0_4_;
    fVar193 = auVar115._0_4_ * 0.04761905;
    local_7a0._0_4_ = auVar229._0_4_;
    local_7a0._4_4_ = local_7a0._0_4_;
    local_7a0._8_4_ = local_7a0._0_4_;
    local_7a0._12_4_ = local_7a0._0_4_;
    local_7a0._16_4_ = local_7a0._0_4_;
    local_7a0._20_4_ = local_7a0._0_4_;
    local_7a0._24_4_ = local_7a0._0_4_;
    local_7a0._28_4_ = local_7a0._0_4_;
    auVar115._4_4_ = auVar115._0_4_;
    auVar115._8_4_ = auVar115._0_4_;
    auVar115._12_4_ = auVar115._0_4_;
    auVar115._16_4_ = auVar115._0_4_;
    auVar115._20_4_ = auVar115._0_4_;
    auVar115._24_4_ = auVar115._0_4_;
    auVar115._28_4_ = auVar115._0_4_;
    auStack_7b0 = auVar115._16_16_;
    auVar100 = vfmadd231ps_fma(local_7a0,auVar115,_DAT_01faff20);
    auVar114 = vsubps_avx(auVar202,ZEXT1632(auVar100));
    fVar226 = auVar100._0_4_;
    fVar206 = auVar100._4_4_;
    fVar230 = auVar100._8_4_;
    fVar207 = auVar100._12_4_;
    fVar96 = auVar114._0_4_;
    fVar231 = auVar114._4_4_;
    fVar240 = auVar114._8_4_;
    fVar241 = auVar114._12_4_;
    fVar242 = auVar114._16_4_;
    fVar243 = auVar114._20_4_;
    fVar244 = auVar114._24_4_;
    auVar229._28_36_ = auVar239._28_36_;
    auVar229._0_28_ =
         ZEXT1628(CONCAT412(fVar207 * fVar207,
                            CONCAT48(fVar230 * fVar230,CONCAT44(fVar206 * fVar206,fVar226 * fVar226)
                                    )));
    fVar245 = fVar226 * 3.0;
    fVar260 = fVar206 * 3.0;
    fVar261 = fVar230 * 3.0;
    fVar262 = fVar207 * 3.0;
    auVar239._0_4_ = fVar96 * fVar96;
    auVar239._4_4_ = fVar231 * fVar231;
    auVar239._8_4_ = fVar240 * fVar240;
    auVar239._12_4_ = fVar241 * fVar241;
    auVar239._16_4_ = fVar242 * fVar242;
    auVar239._20_4_ = fVar243 * fVar243;
    auVar239._28_36_ = auVar274._28_36_;
    auVar239._24_4_ = fVar244 * fVar244;
    fVar209 = auVar114._28_4_;
    auVar274._0_4_ = (auVar239._0_4_ * (fVar96 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar274._4_4_ = (auVar239._4_4_ * (fVar231 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar274._8_4_ = (auVar239._8_4_ * (fVar240 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar274._12_4_ = (auVar239._12_4_ * (fVar241 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar274._16_4_ = (auVar239._16_4_ * (fVar242 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar274._20_4_ = (auVar239._20_4_ * (fVar243 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar274._28_36_ = auVar290._28_36_;
    auVar274._24_4_ = (auVar239._24_4_ * (fVar244 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar114 = auVar274._0_32_;
    fVar210 = fVar226 * fVar226 * (float)((uint)fVar96 ^ local_840) * 0.5;
    fVar220 = fVar206 * fVar206 * (float)((uint)fVar231 ^ uStack_83c) * 0.5;
    fVar221 = fVar230 * fVar230 * (float)((uint)fVar240 ^ uStack_838) * 0.5;
    fVar222 = fVar207 * fVar207 * (float)((uint)fVar241 ^ uStack_834) * 0.5;
    fVar223 = (float)((uint)fVar242 ^ (uint)fStack_830) * 0.0 * 0.0 * 0.5;
    fVar224 = (float)((uint)fVar243 ^ (uint)fStack_82c) * 0.0 * 0.0 * 0.5;
    fVar225 = (float)((uint)fVar244 ^ (uint)fStack_828) * 0.0 * 0.0 * 0.5;
    auVar280._4_4_ = fStack_27c * fVar220;
    auVar280._0_4_ = local_280 * fVar210;
    auVar280._8_4_ = fStack_278 * fVar221;
    auVar280._12_4_ = fStack_274 * fVar222;
    auVar280._16_4_ = fStack_270 * fVar223;
    auVar280._20_4_ = fStack_26c * fVar224;
    auVar280._24_4_ = fStack_268 * fVar225;
    auVar280._28_4_ = auVar266._28_4_ + -5.0 + 2.0;
    auVar167._0_4_ = fVar210 * (float)local_4a0;
    auVar167._4_4_ = fVar220 * local_4a0._4_4_;
    auVar167._8_4_ = fVar221 * (float)uStack_498;
    auVar167._12_4_ = fVar222 * uStack_498._4_4_;
    auVar167._16_4_ = fVar223 * (float)uStack_490;
    auVar167._20_4_ = fVar224 * uStack_490._4_4_;
    auVar167._24_4_ = fVar225 * (float)uStack_488;
    auVar167._28_4_ = 0;
    auVar13._4_4_ = fVar220 * local_4c0._4_4_;
    auVar13._0_4_ = fVar210 * (float)local_4c0;
    auVar13._8_4_ = fVar221 * (float)uStack_4b8;
    auVar13._12_4_ = fVar222 * uStack_4b8._4_4_;
    auVar13._16_4_ = fVar223 * (float)uStack_4b0;
    auVar13._20_4_ = fVar224 * uStack_4b0._4_4_;
    auVar13._24_4_ = fVar225 * (float)uStack_4a8;
    auVar13._28_4_ = 0x40000000;
    auVar255._4_4_ = fVar220 * local_4e0._4_4_;
    auVar255._0_4_ = fVar210 * (float)local_4e0;
    auVar255._8_4_ = fVar221 * (float)uStack_4d8;
    auVar255._12_4_ = fVar222 * uStack_4d8._4_4_;
    auVar255._16_4_ = fVar223 * (float)uStack_4d0;
    auVar255._20_4_ = fVar224 * uStack_4d0._4_4_;
    auVar255._24_4_ = fVar225 * (float)uStack_4c8;
    auVar255._28_4_ = uStack_824;
    auVar168._4_4_ = uStack_53c;
    auVar168._0_4_ = local_540;
    auVar168._8_4_ = uStack_538;
    auVar168._12_4_ = uStack_534;
    auVar168._16_4_ = uStack_530;
    auVar168._20_4_ = uStack_52c;
    auVar168._24_4_ = uStack_528;
    auVar168._28_4_ = uStack_524;
    auVar100 = vfmadd231ps_fma(auVar280,auVar114,auVar168);
    auVar69._8_8_ = uStack_438;
    auVar69._0_8_ = local_440;
    auVar69._16_8_ = uStack_430;
    auVar69._24_8_ = uStack_428;
    auVar99 = vfmadd231ps_fma(auVar167,auVar114,auVar69);
    auVar67._8_8_ = uStack_458;
    auVar67._0_8_ = local_460;
    auVar67._16_8_ = uStack_450;
    auVar67._24_8_ = uStack_448;
    auVar155 = vfmadd231ps_fma(auVar13,auVar114,auVar67);
    auVar65._8_8_ = uStack_478;
    auVar65._0_8_ = local_480;
    auVar65._16_8_ = uStack_470;
    auVar65._24_8_ = uStack_468;
    auVar107 = vfmadd231ps_fma(auVar255,auVar114,auVar65);
    auVar121._4_4_ = fVar231 * fVar231 * (float)((uint)fVar206 ^ uStack_83c) * 0.5;
    auVar121._0_4_ = fVar96 * fVar96 * (float)((uint)fVar226 ^ local_840) * 0.5;
    auVar121._8_4_ = fVar240 * fVar240 * (float)((uint)fVar230 ^ uStack_838) * 0.5;
    auVar121._12_4_ = fVar241 * fVar241 * (float)((uint)fVar207 ^ uStack_834) * 0.5;
    auVar121._16_4_ = fVar242 * fVar242 * fStack_830 * 0.5;
    auVar121._20_4_ = fVar243 * fVar243 * fStack_82c * 0.5;
    auVar121._24_4_ = fVar244 * fVar244 * fStack_828 * 0.5;
    auVar121._28_4_ = auVar283._28_4_;
    auVar144._4_4_ = ((fVar260 + -5.0) * fVar206 * fVar206 + 2.0) * 0.5;
    auVar144._0_4_ = ((fVar245 + -5.0) * fVar226 * fVar226 + 2.0) * 0.5;
    auVar144._8_4_ = ((fVar261 + -5.0) * fVar230 * fVar230 + 2.0) * 0.5;
    auVar144._12_4_ = ((fVar262 + -5.0) * fVar207 * fVar207 + 2.0) * 0.5;
    auVar144._16_4_ = 0x3f800000;
    auVar144._20_4_ = 0x3f800000;
    auVar144._24_4_ = 0x3f800000;
    auVar144._28_4_ = auVar290._28_4_ + 2.0;
    auVar61._4_4_ = uStack_51c;
    auVar61._0_4_ = local_520;
    auVar61._8_4_ = uStack_518;
    auVar61._12_4_ = uStack_514;
    auVar61._16_4_ = uStack_510;
    auVar61._20_4_ = uStack_50c;
    auVar61._24_4_ = uStack_508;
    auVar61._28_4_ = uStack_504;
    auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar144,auVar61);
    auVar75._8_8_ = uStack_3d8;
    auVar75._0_8_ = local_3e0;
    auVar75._16_8_ = uStack_3d0;
    auVar75._24_8_ = uStack_3c8;
    auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar144,auVar75);
    auVar73._8_8_ = uStack_3f8;
    auVar73._0_8_ = local_400;
    auVar73._16_8_ = uStack_3f0;
    auVar73._24_8_ = uStack_3e8;
    auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar144,auVar73);
    auVar71._8_8_ = uStack_418;
    auVar71._0_8_ = local_420;
    auVar71._16_8_ = uStack_410;
    auVar71._24_8_ = uStack_408;
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar144,auVar71);
    auVar63._4_4_ = uStack_4fc;
    auVar63._0_4_ = local_500;
    auVar63._8_4_ = uStack_4f8;
    auVar63._12_4_ = uStack_4f4;
    auVar63._16_4_ = uStack_4f0;
    auVar63._20_4_ = uStack_4ec;
    auVar63._24_4_ = uStack_4e8;
    auVar63._28_4_ = uStack_4e4;
    auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar121,auVar63);
    auVar83._8_8_ = uStack_1d8;
    auVar83._0_8_ = local_1e0;
    auVar83._16_8_ = uStack_1d0;
    auVar83._24_8_ = uStack_1c8;
    auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar121,auVar83);
    auVar168 = ZEXT1632(auVar99);
    auVar77._8_8_ = uStack_3b8;
    auVar77._0_8_ = local_3c0;
    auVar77._16_8_ = uStack_3b0;
    auVar77._24_8_ = uStack_3a8;
    auVar99 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar121,auVar77);
    auVar82._8_8_ = uStack_1f8;
    auVar82._0_8_ = local_200;
    auVar82._16_8_ = uStack_1f0;
    auVar82._24_8_ = uStack_1e8;
    auVar155 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar82,auVar121);
    auVar204._4_4_ = (fVar231 + fVar231) * fVar206;
    auVar204._0_4_ = (fVar96 + fVar96) * fVar226;
    auVar204._8_4_ = (fVar240 + fVar240) * fVar230;
    auVar204._12_4_ = (fVar241 + fVar241) * fVar207;
    auVar204._16_4_ = (fVar242 + fVar242) * 0.0;
    auVar204._20_4_ = (fVar243 + fVar243) * 0.0;
    auVar204._24_4_ = (fVar244 + fVar244) * 0.0;
    auVar204._28_4_ = 0;
    auVar114 = vsubps_avx(auVar204,auVar239._0_32_);
    fVar210 = auVar259._28_4_ + 2.0;
    auVar15._4_4_ = (fVar231 + fVar231) * (fVar260 + 2.0);
    auVar15._0_4_ = (fVar96 + fVar96) * (fVar245 + 2.0);
    auVar15._8_4_ = (fVar240 + fVar240) * (fVar261 + 2.0);
    auVar15._12_4_ = (fVar241 + fVar241) * (fVar262 + 2.0);
    auVar15._16_4_ = (fVar242 + fVar242) * 2.0;
    auVar15._20_4_ = (fVar243 + fVar243) * 2.0;
    auVar15._24_4_ = (fVar244 + fVar244) * 2.0;
    auVar15._28_4_ = fVar210;
    auVar16._4_4_ = fVar231 * 3.0 * fVar231;
    auVar16._0_4_ = fVar96 * 3.0 * fVar96;
    auVar16._8_4_ = fVar240 * 3.0 * fVar240;
    auVar16._12_4_ = fVar241 * 3.0 * fVar241;
    auVar16._16_4_ = fVar242 * 3.0 * fVar242;
    auVar16._20_4_ = fVar243 * 3.0 * fVar243;
    auVar16._24_4_ = fVar244 * 3.0 * fVar244;
    auVar16._28_4_ = fVar209;
    auVar147 = vsubps_avx(auVar15,auVar16);
    auVar280 = vsubps_avx(auVar229._0_32_,auVar204);
    auVar116._4_4_ = auVar114._4_4_ * 0.5;
    auVar116._0_4_ = auVar114._0_4_ * 0.5;
    auVar116._8_4_ = auVar114._8_4_ * 0.5;
    auVar116._12_4_ = auVar114._12_4_ * 0.5;
    auVar116._16_4_ = auVar114._16_4_ * 0.5;
    auVar116._20_4_ = auVar114._20_4_ * 0.5;
    auVar116._24_4_ = auVar114._24_4_ * 0.5;
    auVar116._28_4_ = fVar210;
    auVar217._28_4_ = auVar259._28_4_ + -5.0 + 0.0;
    auVar217._0_28_ =
         ZEXT1628(CONCAT412(((fVar207 + fVar207) * (fVar262 + -5.0) + fVar262 * fVar207) * 0.5,
                            CONCAT48(((fVar230 + fVar230) * (fVar261 + -5.0) + fVar261 * fVar230) *
                                     0.5,CONCAT44(((fVar206 + fVar206) * (fVar260 + -5.0) +
                                                  fVar260 * fVar206) * 0.5,
                                                  ((fVar226 + fVar226) * (fVar245 + -5.0) +
                                                  fVar245 * fVar226) * 0.5))));
    auVar273._4_4_ = auVar147._4_4_ * 0.5;
    auVar273._0_4_ = auVar147._0_4_ * 0.5;
    auVar273._8_4_ = auVar147._8_4_ * 0.5;
    auVar273._12_4_ = auVar147._12_4_ * 0.5;
    auVar273._16_4_ = auVar147._16_4_ * 0.5;
    auVar273._20_4_ = auVar147._20_4_ * 0.5;
    fVar96 = auVar147._28_4_;
    auVar273._24_4_ = auVar147._24_4_ * 0.5;
    auVar273._28_4_ = fVar96;
    fVar231 = auVar280._0_4_ * 0.5;
    fVar240 = auVar280._4_4_ * 0.5;
    fVar241 = auVar280._8_4_ * 0.5;
    fVar242 = auVar280._12_4_ * 0.5;
    fVar243 = auVar280._16_4_ * 0.5;
    fVar244 = auVar280._20_4_ * 0.5;
    fVar210 = auVar280._24_4_ * 0.5;
    auVar296._4_4_ = fStack_27c * fVar240;
    auVar296._0_4_ = local_280 * fVar231;
    auVar296._8_4_ = fStack_278 * fVar241;
    auVar296._12_4_ = fStack_274 * fVar242;
    auVar296._16_4_ = fStack_270 * fVar243;
    auVar296._20_4_ = fStack_26c * fVar244;
    auVar296._24_4_ = fStack_268 * fVar210;
    auVar296._28_4_ = auVar266._28_4_;
    auVar8._4_4_ = fVar240 * local_4a0._4_4_;
    auVar8._0_4_ = fVar231 * (float)local_4a0;
    auVar8._8_4_ = fVar241 * (float)uStack_498;
    auVar8._12_4_ = fVar242 * uStack_498._4_4_;
    auVar8._16_4_ = fVar243 * (float)uStack_490;
    auVar8._20_4_ = fVar244 * uStack_490._4_4_;
    auVar8._24_4_ = fVar210 * (float)uStack_488;
    auVar8._28_4_ = 0x40000000;
    auVar236._4_4_ = fVar240 * local_4c0._4_4_;
    auVar236._0_4_ = fVar231 * (float)local_4c0;
    auVar236._8_4_ = fVar241 * (float)uStack_4b8;
    auVar236._12_4_ = fVar242 * uStack_4b8._4_4_;
    auVar236._16_4_ = fVar243 * (float)uStack_4b0;
    auVar236._20_4_ = fVar244 * uStack_4b0._4_4_;
    auVar236._24_4_ = fVar210 * (float)uStack_4a8;
    auVar236._28_4_ = auVar114._28_4_;
    auVar14._4_4_ = fVar240 * local_4e0._4_4_;
    auVar14._0_4_ = fVar231 * (float)local_4e0;
    auVar14._8_4_ = fVar241 * (float)uStack_4d8;
    auVar14._12_4_ = fVar242 * uStack_4d8._4_4_;
    auVar14._16_4_ = fVar243 * (float)uStack_4d0;
    auVar14._20_4_ = fVar244 * uStack_4d0._4_4_;
    auVar14._24_4_ = fVar210 * (float)uStack_4c8;
    auVar14._28_4_ = auVar280._28_4_;
    auVar60._4_4_ = uStack_53c;
    auVar60._0_4_ = local_540;
    auVar60._8_4_ = uStack_538;
    auVar60._12_4_ = uStack_534;
    auVar60._16_4_ = uStack_530;
    auVar60._20_4_ = uStack_52c;
    auVar60._24_4_ = uStack_528;
    auVar60._28_4_ = uStack_524;
    auVar107 = vfmadd231ps_fma(auVar296,auVar273,auVar60);
    auVar70._8_8_ = uStack_438;
    auVar70._0_8_ = local_440;
    auVar70._16_8_ = uStack_430;
    auVar70._24_8_ = uStack_428;
    auVar98 = vfmadd231ps_fma(auVar8,auVar273,auVar70);
    auVar68._8_8_ = uStack_458;
    auVar68._0_8_ = local_460;
    auVar68._16_8_ = uStack_450;
    auVar68._24_8_ = uStack_448;
    auVar130 = vfmadd231ps_fma(auVar236,auVar273,auVar68);
    auVar66._8_8_ = uStack_478;
    auVar66._0_8_ = local_480;
    auVar66._16_8_ = uStack_470;
    auVar66._24_8_ = uStack_468;
    auVar165 = vfmadd231ps_fma(auVar14,auVar273,auVar66);
    auVar62._4_4_ = uStack_51c;
    auVar62._0_4_ = local_520;
    auVar62._8_4_ = uStack_518;
    auVar62._12_4_ = uStack_514;
    auVar62._16_4_ = uStack_510;
    auVar62._20_4_ = uStack_50c;
    auVar62._24_4_ = uStack_508;
    auVar62._28_4_ = uStack_504;
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar217,auVar62);
    auVar76._8_8_ = uStack_3d8;
    auVar76._0_8_ = local_3e0;
    auVar76._16_8_ = uStack_3d0;
    auVar76._24_8_ = uStack_3c8;
    auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar217,auVar76);
    auVar74._8_8_ = uStack_3f8;
    auVar74._0_8_ = local_400;
    auVar74._16_8_ = uStack_3f0;
    auVar74._24_8_ = uStack_3e8;
    auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar217,auVar74);
    auVar72._8_8_ = uStack_418;
    auVar72._0_8_ = local_420;
    auVar72._16_8_ = uStack_410;
    auVar72._24_8_ = uStack_408;
    auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar217,auVar72);
    auVar64._4_4_ = uStack_4fc;
    auVar64._0_4_ = local_500;
    auVar64._8_4_ = uStack_4f8;
    auVar64._12_4_ = uStack_4f4;
    auVar64._16_4_ = uStack_4f0;
    auVar64._20_4_ = uStack_4ec;
    auVar64._24_4_ = uStack_4e8;
    auVar64._28_4_ = uStack_4e4;
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar116,auVar64);
    auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar116,auVar83);
    auVar78._8_8_ = uStack_3b8;
    auVar78._0_8_ = local_3c0;
    auVar78._16_8_ = uStack_3b0;
    auVar78._24_8_ = uStack_3a8;
    auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar116,auVar78);
    auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar82,auVar116);
    auVar264._0_4_ = auVar107._0_4_ * fVar193;
    auVar264._4_4_ = auVar107._4_4_ * fVar193;
    auVar264._8_4_ = auVar107._8_4_ * fVar193;
    auVar264._12_4_ = auVar107._12_4_ * fVar193;
    auVar264._16_4_ = fVar193 * 0.0;
    auVar264._20_4_ = fVar193 * 0.0;
    auVar264._24_4_ = fVar193 * 0.0;
    auVar264._28_4_ = 0;
    fVar243 = auVar98._0_4_ * fVar193;
    fVar210 = auVar98._4_4_ * fVar193;
    local_780._4_4_ = fVar210;
    local_780._0_4_ = fVar243;
    fVar222 = auVar98._8_4_ * fVar193;
    local_780._8_4_ = fVar222;
    fVar223 = auVar98._12_4_ * fVar193;
    local_780._12_4_ = fVar223;
    local_780._16_4_ = fVar193 * 0.0;
    local_780._20_4_ = fVar193 * 0.0;
    local_780._24_4_ = fVar193 * 0.0;
    local_780._28_4_ = fVar209 + fVar209;
    fVar295 = auVar130._0_4_ * fVar193;
    fVar297 = auVar130._4_4_ * fVar193;
    auVar19._4_4_ = fVar297;
    auVar19._0_4_ = fVar295;
    fVar298 = auVar130._8_4_ * fVar193;
    auVar19._8_4_ = fVar298;
    fVar299 = auVar130._12_4_ * fVar193;
    auVar19._12_4_ = fVar299;
    fVar300 = fVar193 * 0.0;
    auVar19._16_4_ = fVar300;
    fVar301 = fVar193 * 0.0;
    auVar19._20_4_ = fVar301;
    fVar302 = fVar193 * 0.0;
    auVar19._24_4_ = fVar302;
    auVar19._28_4_ = 0x3f000000;
    fVar231 = fVar193 * auVar165._0_4_;
    fVar240 = fVar193 * auVar165._4_4_;
    auVar20._4_4_ = fVar240;
    auVar20._0_4_ = fVar231;
    fVar241 = fVar193 * auVar165._8_4_;
    auVar20._8_4_ = fVar241;
    fVar242 = fVar193 * auVar165._12_4_;
    auVar20._12_4_ = fVar242;
    auVar20._16_4_ = fVar193 * 0.0;
    auVar20._20_4_ = fVar193 * 0.0;
    auVar20._24_4_ = fVar193 * 0.0;
    auVar20._28_4_ = fVar96;
    auVar116 = ZEXT1632(auVar100);
    local_a20 = vpermps_avx2(_DAT_01fec480,auVar116);
    local_760 = vpermps_avx2(_DAT_01fec480,auVar168);
    local_a40 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar99));
    local_660 = vsubps_avx(local_a20,ZEXT1632(auVar100));
    local_640 = vsubps_avx(local_a40,ZEXT1632(auVar99));
    fVar244 = local_640._0_4_;
    fVar220 = local_640._4_4_;
    auVar21._4_4_ = fVar220 * auVar264._4_4_;
    auVar21._0_4_ = fVar244 * auVar264._0_4_;
    fVar221 = local_640._8_4_;
    auVar21._8_4_ = fVar221 * auVar264._8_4_;
    fVar225 = local_640._12_4_;
    auVar21._12_4_ = fVar225 * auVar264._12_4_;
    fVar207 = local_640._16_4_;
    auVar21._16_4_ = fVar207 * auVar264._16_4_;
    fVar260 = local_640._20_4_;
    auVar21._20_4_ = fVar260 * auVar264._20_4_;
    fVar261 = local_640._24_4_;
    auVar21._24_4_ = fVar261 * auVar264._24_4_;
    auVar21._28_4_ = local_a20._28_4_;
    auVar100 = vfmsub231ps_fma(auVar21,auVar19,local_660);
    local_240 = vsubps_avx(local_760,auVar168);
    fVar262 = local_660._0_4_;
    fVar208 = local_660._4_4_;
    auVar22._4_4_ = fVar208 * fVar210;
    auVar22._0_4_ = fVar262 * fVar243;
    fVar284 = local_660._8_4_;
    auVar22._8_4_ = fVar284 * fVar222;
    fVar275 = local_660._12_4_;
    auVar22._12_4_ = fVar275 * fVar223;
    fVar276 = local_660._16_4_;
    auVar22._16_4_ = fVar276 * fVar193 * 0.0;
    fVar277 = local_660._20_4_;
    auVar22._20_4_ = fVar277 * fVar193 * 0.0;
    fVar291 = local_660._24_4_;
    auVar22._24_4_ = fVar291 * fVar193 * 0.0;
    auVar22._28_4_ = local_760._28_4_;
    auVar107 = vfmsub231ps_fma(auVar22,auVar264,local_240);
    auVar100 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar107._12_4_ * auVar107._12_4_,
                                                  CONCAT48(auVar107._8_4_ * auVar107._8_4_,
                                                           CONCAT44(auVar107._4_4_ * auVar107._4_4_,
                                                                    auVar107._0_4_ * auVar107._0_4_)
                                                          ))),ZEXT1632(auVar100),ZEXT1632(auVar100))
    ;
    fVar209 = local_240._0_4_;
    fVar210 = local_240._4_4_;
    auVar23._4_4_ = fVar210 * fVar297;
    auVar23._0_4_ = fVar209 * fVar295;
    fVar222 = local_240._8_4_;
    auVar23._8_4_ = fVar222 * fVar298;
    fVar223 = local_240._12_4_;
    auVar23._12_4_ = fVar223 * fVar299;
    fVar224 = local_240._16_4_;
    auVar23._16_4_ = fVar224 * fVar300;
    fVar226 = local_240._20_4_;
    auVar23._20_4_ = fVar226 * fVar301;
    fVar206 = local_240._24_4_;
    auVar23._24_4_ = fVar206 * fVar302;
    auVar23._28_4_ = local_a40._28_4_;
    auVar98 = vfmsub231ps_fma(auVar23,local_780,local_640);
    auVar188._0_4_ = fVar244 * fVar244;
    auVar188._4_4_ = fVar220 * fVar220;
    auVar188._8_4_ = fVar221 * fVar221;
    auVar188._12_4_ = fVar225 * fVar225;
    auVar188._16_4_ = fVar207 * fVar207;
    auVar188._20_4_ = fVar260 * fVar260;
    auVar188._24_4_ = fVar261 * fVar261;
    auVar188._28_4_ = 0;
    auVar107 = vfmadd231ps_fma(auVar188,local_240,local_240);
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),local_660,local_660);
    auVar114 = vrcpps_avx(ZEXT1632(auVar107));
    auVar98 = vfmadd231ps_fma(ZEXT1632(auVar100),ZEXT1632(auVar98),ZEXT1632(auVar98));
    auVar117._8_4_ = 0x3f800000;
    auVar117._0_8_ = 0x3f8000003f800000;
    auVar117._12_4_ = 0x3f800000;
    auVar117._16_4_ = 0x3f800000;
    auVar117._20_4_ = 0x3f800000;
    auVar117._24_4_ = 0x3f800000;
    auVar117._28_4_ = 0x3f800000;
    auVar100 = vfnmadd213ps_fma(auVar114,ZEXT1632(auVar107),auVar117);
    auVar100 = vfmadd132ps_fma(ZEXT1632(auVar100),auVar114,auVar114);
    auVar144 = vpermps_avx2(_DAT_01fec480,auVar264);
    auVar204 = vpermps_avx2(_DAT_01fec480,auVar19);
    auVar24._4_4_ = fVar220 * auVar144._4_4_;
    auVar24._0_4_ = fVar244 * auVar144._0_4_;
    auVar24._8_4_ = fVar221 * auVar144._8_4_;
    auVar24._12_4_ = fVar225 * auVar144._12_4_;
    auVar24._16_4_ = fVar207 * auVar144._16_4_;
    auVar24._20_4_ = fVar260 * auVar144._20_4_;
    auVar24._24_4_ = fVar261 * auVar144._24_4_;
    auVar24._28_4_ = auVar114._28_4_;
    auVar130 = vfmsub231ps_fma(auVar24,auVar204,local_660);
    local_9c0 = vpermps_avx2(_DAT_01fec480,local_780);
    auVar25._4_4_ = fVar208 * local_9c0._4_4_;
    auVar25._0_4_ = fVar262 * local_9c0._0_4_;
    auVar25._8_4_ = fVar284 * local_9c0._8_4_;
    auVar25._12_4_ = fVar275 * local_9c0._12_4_;
    auVar25._16_4_ = fVar276 * local_9c0._16_4_;
    auVar25._20_4_ = fVar277 * local_9c0._20_4_;
    auVar25._24_4_ = fVar291 * local_9c0._24_4_;
    auVar25._28_4_ = 0;
    auVar165 = vfmsub231ps_fma(auVar25,auVar144,local_240);
    auVar130 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar165._12_4_ * auVar165._12_4_,
                                                  CONCAT48(auVar165._8_4_ * auVar165._8_4_,
                                                           CONCAT44(auVar165._4_4_ * auVar165._4_4_,
                                                                    auVar165._0_4_ * auVar165._0_4_)
                                                          ))),ZEXT1632(auVar130),ZEXT1632(auVar130))
    ;
    auVar250._0_4_ = fVar209 * auVar204._0_4_;
    auVar250._4_4_ = fVar210 * auVar204._4_4_;
    auVar250._8_4_ = fVar222 * auVar204._8_4_;
    auVar250._12_4_ = fVar223 * auVar204._12_4_;
    auVar250._16_4_ = fVar224 * auVar204._16_4_;
    auVar250._20_4_ = fVar226 * auVar204._20_4_;
    auVar250._24_4_ = fVar206 * auVar204._24_4_;
    auVar250._28_4_ = 0;
    auVar165 = vfmsub231ps_fma(auVar250,local_9c0,local_640);
    auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),ZEXT1632(auVar165),ZEXT1632(auVar165));
    auVar114 = vmaxps_avx(ZEXT1632(CONCAT412(auVar98._12_4_ * auVar100._12_4_,
                                             CONCAT48(auVar98._8_4_ * auVar100._8_4_,
                                                      CONCAT44(auVar98._4_4_ * auVar100._4_4_,
                                                               auVar98._0_4_ * auVar100._0_4_)))),
                          ZEXT1632(CONCAT412(auVar130._12_4_ * auVar100._12_4_,
                                             CONCAT48(auVar130._8_4_ * auVar100._8_4_,
                                                      CONCAT44(auVar130._4_4_ * auVar100._4_4_,
                                                               auVar130._0_4_ * auVar100._0_4_)))));
    auVar228._0_4_ = auVar155._0_4_ + fVar231;
    auVar228._4_4_ = auVar155._4_4_ + fVar240;
    auVar228._8_4_ = auVar155._8_4_ + fVar241;
    auVar228._12_4_ = auVar155._12_4_ + fVar242;
    auVar228._16_4_ = fVar193 * 0.0 + 0.0;
    auVar228._20_4_ = fVar193 * 0.0 + 0.0;
    auVar228._24_4_ = fVar193 * 0.0 + 0.0;
    auVar228._28_4_ = fVar96 + 0.0;
    auVar217 = ZEXT1632(auVar155);
    auVar147 = vsubps_avx(auVar217,auVar20);
    auVar15 = vpermps_avx2(_DAT_01fec480,auVar147);
    auVar16 = vpermps_avx2(_DAT_01fec480,auVar217);
    auVar147 = vmaxps_avx(auVar217,auVar228);
    auVar280 = vmaxps_avx(auVar15,auVar16);
    auVar13 = vrsqrtps_avx(ZEXT1632(auVar107));
    auVar147 = vmaxps_avx(auVar147,auVar280);
    fVar193 = auVar13._0_4_;
    fVar96 = auVar13._4_4_;
    fVar231 = auVar13._8_4_;
    fVar240 = auVar13._12_4_;
    fVar241 = auVar13._16_4_;
    fVar242 = auVar13._20_4_;
    fVar243 = auVar13._24_4_;
    auVar265._0_4_ = fVar193 * fVar193 * fVar193 * auVar107._0_4_ * -0.5;
    auVar265._4_4_ = fVar96 * fVar96 * fVar96 * auVar107._4_4_ * -0.5;
    auVar265._8_4_ = fVar231 * fVar231 * fVar231 * auVar107._8_4_ * -0.5;
    auVar265._12_4_ = fVar240 * fVar240 * fVar240 * auVar107._12_4_ * -0.5;
    auVar265._16_4_ = fVar241 * fVar241 * fVar241 * -0.0;
    auVar265._20_4_ = fVar242 * fVar242 * fVar242 * -0.0;
    auVar265._24_4_ = fVar243 * fVar243 * fVar243 * -0.0;
    auVar265._28_4_ = 0;
    auVar139._8_4_ = 0x3fc00000;
    auVar139._0_8_ = 0x3fc000003fc00000;
    auVar139._12_4_ = 0x3fc00000;
    auVar139._16_4_ = 0x3fc00000;
    auVar139._20_4_ = 0x3fc00000;
    auVar139._24_4_ = 0x3fc00000;
    auVar139._28_4_ = 0x3fc00000;
    auVar100 = vfmadd231ps_fma(auVar265,auVar139,auVar13);
    auVar266 = ZEXT1664(auVar100);
    fVar96 = auVar100._0_4_;
    fVar241 = auVar100._4_4_;
    auVar26._4_4_ = fVar210 * fVar241;
    auVar26._0_4_ = fVar209 * fVar96;
    fVar209 = auVar100._8_4_;
    auVar26._8_4_ = fVar222 * fVar209;
    fVar222 = auVar100._12_4_;
    auVar26._12_4_ = fVar223 * fVar222;
    auVar26._16_4_ = fVar224 * 0.0;
    auVar26._20_4_ = fVar226 * 0.0;
    auVar26._24_4_ = fVar206 * 0.0;
    auVar26._28_4_ = 0;
    fVar231 = local_a60._0_4_;
    fVar242 = local_a60._4_4_;
    auVar27._4_4_ = fVar220 * fVar241 * fVar242;
    auVar27._0_4_ = fVar244 * fVar96 * fVar231;
    fVar210 = local_a60._8_4_;
    auVar27._8_4_ = fVar221 * fVar209 * fVar210;
    fVar223 = local_a60._12_4_;
    auVar27._12_4_ = fVar225 * fVar222 * fVar223;
    fVar226 = local_a60._16_4_;
    auVar27._16_4_ = fVar207 * 0.0 * fVar226;
    fVar230 = local_a60._20_4_;
    auVar27._20_4_ = fVar260 * 0.0 * fVar230;
    fVar245 = local_a60._24_4_;
    auVar27._24_4_ = fVar261 * 0.0 * fVar245;
    auVar27._28_4_ = local_240._28_4_;
    auVar100 = vfmadd231ps_fma(auVar27,auVar26,_local_7e0);
    local_620 = ZEXT1632(auVar99);
    auVar280 = vsubps_avx(ZEXT832(0) << 0x20,local_620);
    fVar240 = auVar280._0_4_;
    fVar243 = auVar280._4_4_;
    auVar28._4_4_ = fVar220 * fVar241 * fVar243;
    auVar28._0_4_ = fVar244 * fVar96 * fVar240;
    fVar220 = auVar280._8_4_;
    auVar28._8_4_ = fVar221 * fVar209 * fVar220;
    fVar224 = auVar280._12_4_;
    auVar28._12_4_ = fVar225 * fVar222 * fVar224;
    fVar206 = auVar280._16_4_;
    auVar28._16_4_ = fVar207 * 0.0 * fVar206;
    fVar207 = auVar280._20_4_;
    auVar28._20_4_ = fVar260 * 0.0 * fVar207;
    fVar260 = auVar280._24_4_;
    auVar28._24_4_ = fVar261 * 0.0 * fVar260;
    auVar28._28_4_ = auVar204._28_4_;
    auVar280 = vsubps_avx(ZEXT832(0) << 0x20,auVar168);
    auVar99 = vfmadd231ps_fma(auVar28,auVar280,auVar26);
    auVar29._4_4_ = fVar208 * fVar241;
    auVar29._0_4_ = fVar262 * fVar96;
    auVar29._8_4_ = fVar284 * fVar209;
    auVar29._12_4_ = fVar275 * fVar222;
    auVar29._16_4_ = fVar276 * 0.0;
    auVar29._20_4_ = fVar277 * 0.0;
    auVar29._24_4_ = fVar291 * 0.0;
    auVar29._28_4_ = 0;
    auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar29,_local_800);
    auVar274 = ZEXT1664(auVar100);
    auVar255 = vsubps_avx(ZEXT832(0) << 0x20,auVar116);
    auVar283 = ZEXT3264(auVar255);
    auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar255,auVar29);
    auVar30._4_4_ = fVar242 * fVar243;
    auVar30._0_4_ = fVar231 * fVar240;
    auVar30._8_4_ = fVar210 * fVar220;
    auVar30._12_4_ = fVar223 * fVar224;
    auVar30._16_4_ = fVar226 * fVar206;
    auVar30._20_4_ = fVar230 * fVar207;
    auVar30._24_4_ = fVar245 * fVar260;
    auVar30._28_4_ = 0;
    auVar155 = vfmadd231ps_fma(auVar30,_local_7e0,auVar280);
    auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),_local_800,auVar255);
    fVar193 = auVar99._0_4_;
    fVar284 = auVar100._0_4_;
    fVar244 = auVar99._4_4_;
    fVar275 = auVar100._4_4_;
    fVar221 = auVar99._8_4_;
    fVar276 = auVar100._8_4_;
    fVar225 = auVar99._12_4_;
    fVar277 = auVar100._12_4_;
    auVar31._28_4_ = auVar13._28_4_;
    auVar31._0_28_ =
         ZEXT1628(CONCAT412(fVar277 * fVar225,
                            CONCAT48(fVar276 * fVar221,CONCAT44(fVar275 * fVar244,fVar284 * fVar193)
                                    )));
    auVar282 = vsubps_avx(ZEXT1632(auVar155),auVar31);
    auVar32._4_4_ = fVar243 * fVar243;
    auVar32._0_4_ = fVar240 * fVar240;
    auVar32._8_4_ = fVar220 * fVar220;
    auVar32._12_4_ = fVar224 * fVar224;
    auVar32._16_4_ = fVar206 * fVar206;
    auVar32._20_4_ = fVar207 * fVar207;
    auVar32._24_4_ = fVar260 * fVar260;
    auVar32._28_4_ = auVar13._28_4_;
    auVar155 = vfmadd231ps_fma(auVar32,auVar280,auVar280);
    auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar255,auVar255);
    auVar13 = vsubps_avx(ZEXT1632(auVar155),
                         ZEXT1632(CONCAT412(fVar225 * fVar225,
                                            CONCAT48(fVar221 * fVar221,
                                                     CONCAT44(fVar244 * fVar244,fVar193 * fVar193)))
                                 ));
    auStack_958 = auVar13._8_24_;
    local_600 = vsqrtps_avx(auVar114);
    fVar193 = (local_600._0_4_ + auVar147._0_4_) * 1.0000002;
    fVar244 = (local_600._4_4_ + auVar147._4_4_) * 1.0000002;
    fVar221 = (local_600._8_4_ + auVar147._8_4_) * 1.0000002;
    fVar225 = (local_600._12_4_ + auVar147._12_4_) * 1.0000002;
    fVar261 = (local_600._16_4_ + auVar147._16_4_) * 1.0000002;
    fVar262 = (local_600._20_4_ + auVar147._20_4_) * 1.0000002;
    fVar208 = (local_600._24_4_ + auVar147._24_4_) * 1.0000002;
    auVar33._4_4_ = fVar244 * fVar244;
    auVar33._0_4_ = fVar193 * fVar193;
    auVar33._8_4_ = fVar221 * fVar221;
    auVar33._12_4_ = fVar225 * fVar225;
    auVar33._16_4_ = fVar261 * fVar261;
    auVar33._20_4_ = fVar262 * fVar262;
    auVar33._24_4_ = fVar208 * fVar208;
    auVar33._28_4_ = local_600._28_4_ + auVar147._28_4_;
    local_a80._0_4_ = auVar282._0_4_ + auVar282._0_4_;
    local_a80._4_4_ = auVar282._4_4_ + auVar282._4_4_;
    local_a80._8_4_ = auVar282._8_4_ + auVar282._8_4_;
    local_a80._12_4_ = auVar282._12_4_ + auVar282._12_4_;
    local_a80._16_4_ = auVar282._16_4_ + auVar282._16_4_;
    local_a80._20_4_ = auVar282._20_4_ + auVar282._20_4_;
    local_a80._24_4_ = auVar282._24_4_ + auVar282._24_4_;
    fVar193 = auVar282._28_4_;
    local_a80._28_4_ = fVar193 + fVar193;
    auVar147 = vsubps_avx(auVar13,auVar33);
    auVar239 = ZEXT3264(auVar147);
    auVar273 = ZEXT1632(auVar100);
    local_300._28_4_ = auVar13._28_4_;
    local_300._0_28_ =
         ZEXT1628(CONCAT412(fVar277 * fVar277,
                            CONCAT48(fVar276 * fVar276,CONCAT44(fVar275 * fVar275,fVar284 * fVar284)
                                    )));
    auVar259 = ZEXT3264(local_220);
    auVar282 = vsubps_avx(local_220,local_300);
    local_5e0._4_4_ = local_a80._4_4_ * local_a80._4_4_;
    local_5e0._0_4_ = (float)local_a80._0_4_ * (float)local_a80._0_4_;
    local_5e0._8_4_ = local_a80._8_4_ * local_a80._8_4_;
    local_5e0._12_4_ = local_a80._12_4_ * local_a80._12_4_;
    local_5e0._16_4_ = local_a80._16_4_ * local_a80._16_4_;
    local_5e0._20_4_ = local_a80._20_4_ * local_a80._20_4_;
    local_5e0._24_4_ = local_a80._24_4_ * local_a80._24_4_;
    local_5e0._28_4_ = local_660._28_4_;
    fVar244 = auVar282._0_4_;
    local_680._0_4_ = fVar244 * 4.0;
    fVar221 = auVar282._4_4_;
    local_680._4_4_ = fVar221 * 4.0;
    fVar225 = auVar282._8_4_;
    fStack_678 = fVar225 * 4.0;
    fVar261 = auVar282._12_4_;
    fStack_674 = fVar261 * 4.0;
    fVar262 = auVar282._16_4_;
    fStack_670 = fVar262 * 4.0;
    fVar208 = auVar282._20_4_;
    fStack_66c = fVar208 * 4.0;
    fVar284 = auVar282._24_4_;
    fStack_668 = fVar284 * 4.0;
    fStack_664 = 4.0;
    auVar34._4_4_ = (float)local_680._4_4_ * auVar147._4_4_;
    auVar34._0_4_ = (float)local_680._0_4_ * auVar147._0_4_;
    auVar34._8_4_ = fStack_678 * auVar147._8_4_;
    auVar34._12_4_ = fStack_674 * auVar147._12_4_;
    auVar34._16_4_ = fStack_670 * auVar147._16_4_;
    auVar34._20_4_ = fStack_66c * auVar147._20_4_;
    auVar34._24_4_ = fStack_668 * auVar147._24_4_;
    auVar34._28_4_ = fVar193;
    auVar121 = vsubps_avx(local_5e0,auVar34);
    auVar114 = vcmpps_avx(auVar121,ZEXT432(0) << 0x20,5);
    auVar296 = ZEXT1632(auVar99);
    fVar193 = auVar282._28_4_;
    if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar114 >> 0x7f,0) == '\0') &&
          (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar114 >> 0xbf,0) == '\0') &&
        (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar114[0x1f])
    {
      fStack_9d8 = INFINITY;
      local_9e0 = (undefined1  [8])0x7f8000007f800000;
      fStack_9d4 = INFINITY;
      uStack_9d0 = 0x7f800000;
      uStack_9cc = 0x7f800000;
      uStack_9c8 = 0x7f800000;
      uStack_9c4 = 0x7f800000;
      auVar189._8_4_ = 0xff800000;
      auVar189._0_8_ = 0xff800000ff800000;
      auVar189._12_4_ = 0xff800000;
      auVar189._16_4_ = 0xff800000;
      auVar189._20_4_ = 0xff800000;
      auVar189._24_4_ = 0xff800000;
      auVar189._28_4_ = 0xff800000;
    }
    else {
      auVar14 = vsqrtps_avx(auVar121);
      auVar285._0_4_ = fVar244 + fVar244;
      auVar285._4_4_ = fVar221 + fVar221;
      auVar285._8_4_ = fVar225 + fVar225;
      auVar285._12_4_ = fVar261 + fVar261;
      auVar285._16_4_ = fVar262 + fVar262;
      auVar285._20_4_ = fVar208 + fVar208;
      auVar285._24_4_ = fVar284 + fVar284;
      auVar285._28_4_ = fVar193 + fVar193;
      auVar236 = vrcpps_avx(auVar285);
      auVar8 = vcmpps_avx(auVar121,ZEXT432(0) << 0x20,5);
      auVar140._8_4_ = 0x3f800000;
      auVar140._0_8_ = 0x3f8000003f800000;
      auVar140._12_4_ = 0x3f800000;
      auVar140._16_4_ = 0x3f800000;
      auVar140._20_4_ = 0x3f800000;
      auVar140._24_4_ = 0x3f800000;
      auVar140._28_4_ = 0x3f800000;
      auVar100 = vfnmadd213ps_fma(auVar285,auVar236,auVar140);
      auVar100 = vfmadd132ps_fma(ZEXT1632(auVar100),auVar236,auVar236);
      auVar190._0_4_ = local_a80._0_4_ ^ local_840;
      auVar190._4_4_ = (uint)local_a80._4_4_ ^ uStack_83c;
      auVar190._8_4_ = (uint)local_a80._8_4_ ^ uStack_838;
      auVar190._12_4_ = (uint)local_a80._12_4_ ^ uStack_834;
      auVar190._16_4_ = (uint)local_a80._16_4_ ^ (uint)fStack_830;
      auVar190._20_4_ = (uint)local_a80._20_4_ ^ (uint)fStack_82c;
      auVar190._24_4_ = (uint)local_a80._24_4_ ^ (uint)fStack_828;
      auVar190._28_4_ = (uint)local_a80._28_4_ ^ uStack_824;
      auVar121 = vsubps_avx(auVar190,auVar14);
      auVar35._4_4_ = auVar100._4_4_ * auVar121._4_4_;
      auVar35._0_4_ = auVar100._0_4_ * auVar121._0_4_;
      auVar35._8_4_ = auVar100._8_4_ * auVar121._8_4_;
      auVar35._12_4_ = auVar100._12_4_ * auVar121._12_4_;
      auVar35._16_4_ = auVar121._16_4_ * 0.0;
      auVar35._20_4_ = auVar121._20_4_ * 0.0;
      auVar35._24_4_ = auVar121._24_4_ * 0.0;
      auVar35._28_4_ = auVar121._28_4_;
      auVar121 = vsubps_avx(auVar14,local_a80);
      auVar36._4_4_ = auVar100._4_4_ * auVar121._4_4_;
      auVar36._0_4_ = auVar100._0_4_ * auVar121._0_4_;
      auVar36._8_4_ = auVar100._8_4_ * auVar121._8_4_;
      auVar36._12_4_ = auVar100._12_4_ * auVar121._12_4_;
      auVar36._16_4_ = auVar121._16_4_ * 0.0;
      auVar36._20_4_ = auVar121._20_4_ * 0.0;
      auVar36._24_4_ = auVar121._24_4_ * 0.0;
      auVar36._28_4_ = auVar121._28_4_;
      auVar100 = vfmadd213ps_fma(auVar273,auVar35,auVar296);
      local_2c0 = fVar96 * auVar100._0_4_;
      fStack_2bc = fVar241 * auVar100._4_4_;
      fStack_2b8 = fVar209 * auVar100._8_4_;
      fStack_2b4 = fVar222 * auVar100._12_4_;
      uStack_2b0 = 0;
      uStack_2ac = 0;
      uStack_2a8 = 0;
      uStack_2a4 = 0x3f800000;
      auVar55._4_4_ = uStack_85c;
      auVar55._0_4_ = local_860;
      auVar55._8_4_ = uStack_858;
      auVar55._12_4_ = uStack_854;
      auVar55._16_4_ = uStack_850;
      auVar55._20_4_ = uStack_84c;
      auVar55._24_4_ = uStack_848;
      auVar55._28_4_ = uStack_844;
      auVar121 = vandps_avx(local_300,auVar55);
      auVar121 = vmaxps_avx(local_560,auVar121);
      auVar37._4_4_ = auVar121._4_4_ * 1.9073486e-06;
      auVar37._0_4_ = auVar121._0_4_ * 1.9073486e-06;
      auVar37._8_4_ = auVar121._8_4_ * 1.9073486e-06;
      auVar37._12_4_ = auVar121._12_4_ * 1.9073486e-06;
      auVar37._16_4_ = auVar121._16_4_ * 1.9073486e-06;
      auVar37._20_4_ = auVar121._20_4_ * 1.9073486e-06;
      auVar37._24_4_ = auVar121._24_4_ * 1.9073486e-06;
      auVar37._28_4_ = auVar121._28_4_;
      auVar121 = vandps_avx(auVar282,auVar55);
      auVar121 = vcmpps_avx(auVar121,auVar37,1);
      auVar259 = ZEXT3264(auVar121);
      auVar100 = vfmadd213ps_fma(auVar273,auVar36,auVar296);
      auVar141._8_4_ = 0x7f800000;
      auVar141._0_8_ = 0x7f8000007f800000;
      auVar141._12_4_ = 0x7f800000;
      auVar141._16_4_ = 0x7f800000;
      auVar141._20_4_ = 0x7f800000;
      auVar141._24_4_ = 0x7f800000;
      auVar141._28_4_ = 0x7f800000;
      _local_9e0 = vblendvps_avx(auVar141,auVar35,auVar8);
      local_2e0 = fVar96 * auVar100._0_4_;
      fStack_2dc = fVar241 * auVar100._4_4_;
      fStack_2d8 = fVar209 * auVar100._8_4_;
      fStack_2d4 = fVar222 * auVar100._12_4_;
      uStack_2d0 = 0;
      uStack_2cc = 0;
      uStack_2c8 = 0;
      uStack_2c4 = local_9e0._28_4_;
      auVar142._8_4_ = 0xff800000;
      auVar142._0_8_ = 0xff800000ff800000;
      auVar142._12_4_ = 0xff800000;
      auVar142._16_4_ = 0xff800000;
      auVar142._20_4_ = 0xff800000;
      auVar142._24_4_ = 0xff800000;
      auVar142._28_4_ = 0xff800000;
      auVar189 = vblendvps_avx(auVar142,auVar36,auVar8);
      auVar236 = auVar8 & auVar121;
      if ((((((((auVar236 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar236 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar236 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar236 >> 0x7f,0) != '\0') ||
            (auVar236 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar236 >> 0xbf,0) != '\0') ||
          (auVar236 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar236[0x1f] < '\0') {
        auVar114 = vandps_avx(auVar121,auVar8);
        auVar121 = vcmpps_avx(auVar147,ZEXT832(0) << 0x20,2);
        auVar239 = ZEXT3264(auVar121);
        auVar150._8_4_ = 0xff800000;
        auVar150._0_8_ = 0xff800000ff800000;
        auVar150._12_4_ = 0xff800000;
        auVar150._16_4_ = 0xff800000;
        auVar150._20_4_ = 0xff800000;
        auVar150._24_4_ = 0xff800000;
        auVar150._28_4_ = 0xff800000;
        auVar218._8_4_ = 0x7f800000;
        auVar218._0_8_ = 0x7f8000007f800000;
        auVar218._12_4_ = 0x7f800000;
        auVar218._16_4_ = 0x7f800000;
        auVar218._20_4_ = 0x7f800000;
        auVar218._24_4_ = 0x7f800000;
        auVar218._28_4_ = 0x7f800000;
        auVar147 = vblendvps_avx(auVar218,auVar150,auVar121);
        auVar100 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
        auVar236 = vpmovsxwd_avx2(auVar100);
        auVar259 = ZEXT3264(auVar236);
        _local_9e0 = vblendvps_avx(_local_9e0,auVar147,auVar236);
        auVar151._8_4_ = 0xff800000;
        auVar151._0_8_ = 0xff800000ff800000;
        auVar151._12_4_ = 0xff800000;
        auVar151._16_4_ = 0xff800000;
        auVar151._20_4_ = 0xff800000;
        auVar151._24_4_ = 0xff800000;
        auVar151._28_4_ = 0xff800000;
        auVar147 = vblendvps_avx(auVar151,auVar218,auVar121);
        auVar189 = vblendvps_avx(auVar189,auVar147,auVar236);
        auVar205._0_8_ = auVar114._0_8_ ^ 0xffffffffffffffff;
        auVar205._8_4_ = auVar114._8_4_ ^ 0xffffffff;
        auVar205._12_4_ = auVar114._12_4_ ^ 0xffffffff;
        auVar205._16_4_ = auVar114._16_4_ ^ 0xffffffff;
        auVar205._20_4_ = auVar114._20_4_ ^ 0xffffffff;
        auVar205._24_4_ = auVar114._24_4_ ^ 0xffffffff;
        auVar205._28_4_ = auVar114._28_4_ ^ 0xffffffff;
        auVar114 = vorps_avx(auVar121,auVar205);
        auVar114 = vandps_avx(auVar8,auVar114);
      }
    }
    auVar290 = ZEXT3264(local_a60);
    auVar147 = local_260 & auVar114;
    if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar147 >> 0x7f,0) != '\0') ||
          (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar147 >> 0xbf,0) != '\0') ||
        (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar147[0x1f] < '\0') {
      fVar275 = *(float *)(ray + k * 4 + 0x80);
      local_590 = ZEXT416((uint)fVar275);
      fVar276 = fVar275 - (float)local_8f0._0_4_;
      auVar203._4_4_ = fVar276;
      auVar203._0_4_ = fVar276;
      auVar203._8_4_ = fVar276;
      auVar203._12_4_ = fVar276;
      auVar203._16_4_ = fVar276;
      auVar203._20_4_ = fVar276;
      auVar203._24_4_ = fVar276;
      auVar203._28_4_ = fVar276;
      auVar8 = vminps_avx(auVar203,auVar189);
      auVar38._4_4_ = fVar243 * fVar297;
      auVar38._0_4_ = fVar240 * fVar295;
      auVar38._8_4_ = fVar220 * fVar298;
      auVar38._12_4_ = fVar224 * fVar299;
      auVar38._16_4_ = fVar206 * fVar300;
      auVar38._20_4_ = fVar207 * fVar301;
      auVar38._24_4_ = fVar260 * fVar302;
      auVar38._28_4_ = fVar276;
      auVar100 = vfmadd213ps_fma(auVar280,local_780,auVar38);
      auVar81._4_4_ = fStack_29c;
      auVar81._0_4_ = local_2a0;
      auVar81._8_4_ = fStack_298;
      auVar81._12_4_ = fStack_294;
      auVar81._16_4_ = fStack_290;
      auVar81._20_4_ = fStack_28c;
      auVar81._24_4_ = fStack_288;
      auVar81._28_4_ = fStack_284;
      auVar121 = vmaxps_avx(auVar81,_local_9e0);
      auVar99 = vfmadd213ps_fma(auVar255,auVar264,ZEXT1632(auVar100));
      auVar39._4_4_ = fVar242 * fVar297;
      auVar39._0_4_ = fVar231 * fVar295;
      auVar39._8_4_ = fVar210 * fVar298;
      auVar39._12_4_ = fVar223 * fVar299;
      auVar39._16_4_ = fVar226 * fVar300;
      auVar39._20_4_ = fVar230 * fVar301;
      auVar39._24_4_ = fVar245 * fVar302;
      auVar39._28_4_ = 0x3f000000;
      auVar100 = vfmadd231ps_fma(auVar39,_local_7e0,local_780);
      auVar155 = vfmadd231ps_fma(ZEXT1632(auVar100),_local_800,auVar264);
      auVar56._4_4_ = uStack_85c;
      auVar56._0_4_ = local_860;
      auVar56._8_4_ = uStack_858;
      auVar56._12_4_ = uStack_854;
      auVar56._16_4_ = uStack_850;
      auVar56._20_4_ = uStack_84c;
      auVar56._24_4_ = uStack_848;
      auVar56._28_4_ = uStack_844;
      auVar147 = vandps_avx(auVar56,ZEXT1632(auVar155));
      auVar143._8_4_ = 0x219392ef;
      auVar143._0_8_ = 0x219392ef219392ef;
      auVar143._12_4_ = 0x219392ef;
      auVar143._16_4_ = 0x219392ef;
      auVar143._20_4_ = 0x219392ef;
      auVar143._24_4_ = 0x219392ef;
      auVar143._28_4_ = 0x219392ef;
      auVar280 = vcmpps_avx(auVar147,auVar143,1);
      auVar147 = vrcpps_avx(ZEXT1632(auVar155));
      auVar286._8_4_ = 0x3f800000;
      auVar286._0_8_ = 0x3f8000003f800000;
      auVar286._12_4_ = 0x3f800000;
      auVar286._16_4_ = 0x3f800000;
      auVar286._20_4_ = 0x3f800000;
      auVar286._24_4_ = 0x3f800000;
      auVar286._28_4_ = 0x3f800000;
      auVar236 = ZEXT1632(auVar155);
      auVar100 = vfnmadd213ps_fma(auVar147,auVar236,auVar286);
      auVar100 = vfmadd132ps_fma(ZEXT1632(auVar100),auVar147,auVar147);
      auVar287._0_4_ = auVar155._0_4_ ^ local_840;
      auVar287._4_4_ = auVar155._4_4_ ^ uStack_83c;
      auVar287._8_4_ = auVar155._8_4_ ^ uStack_838;
      auVar287._12_4_ = auVar155._12_4_ ^ uStack_834;
      auVar287._16_4_ = fStack_830;
      auVar287._20_4_ = fStack_82c;
      auVar287._24_4_ = fStack_828;
      auVar287._28_4_ = uStack_824;
      auVar40._4_4_ = auVar100._4_4_ * (float)(auVar99._4_4_ ^ uStack_83c);
      auVar40._0_4_ = auVar100._0_4_ * (float)(auVar99._0_4_ ^ local_840);
      auVar40._8_4_ = auVar100._8_4_ * (float)(auVar99._8_4_ ^ uStack_838);
      auVar40._12_4_ = auVar100._12_4_ * (float)(auVar99._12_4_ ^ uStack_834);
      auVar40._16_4_ = fStack_830 * 0.0;
      auVar40._20_4_ = fStack_82c * 0.0;
      auVar40._24_4_ = fStack_828 * 0.0;
      auVar40._28_4_ = uStack_824;
      auVar147 = vcmpps_avx(auVar236,auVar287,1);
      auVar147 = vorps_avx(auVar280,auVar147);
      auVar279._8_4_ = 0xff800000;
      auVar279._0_8_ = 0xff800000ff800000;
      auVar279._12_4_ = 0xff800000;
      auVar279._16_4_ = 0xff800000;
      auVar279._20_4_ = 0xff800000;
      auVar279._24_4_ = 0xff800000;
      auVar279._28_4_ = 0xff800000;
      auVar147 = vblendvps_avx(auVar40,auVar279,auVar147);
      auVar255 = vmaxps_avx(auVar121,auVar147);
      auVar147 = vcmpps_avx(auVar236,auVar287,6);
      auVar147 = vorps_avx(auVar280,auVar147);
      auVar288._8_4_ = 0x7f800000;
      auVar288._0_8_ = 0x7f8000007f800000;
      auVar288._12_4_ = 0x7f800000;
      auVar288._16_4_ = 0x7f800000;
      auVar288._20_4_ = 0x7f800000;
      auVar288._24_4_ = 0x7f800000;
      auVar288._28_4_ = 0x7f800000;
      auVar147 = vblendvps_avx(auVar40,auVar288,auVar147);
      auVar121 = vminps_avx(auVar8,auVar147);
      auVar290 = ZEXT3264(auVar121);
      fVar240 = (float)(local_840 ^ (uint)auVar204._0_4_);
      fVar243 = (float)(uStack_83c ^ (uint)auVar204._4_4_);
      fVar220 = (float)(uStack_838 ^ (uint)auVar204._8_4_);
      fVar224 = (float)(uStack_834 ^ (uint)auVar204._12_4_);
      fVar206 = (float)((uint)fStack_830 ^ (uint)auVar204._16_4_);
      fVar207 = (float)((uint)fStack_82c ^ (uint)auVar204._20_4_);
      fVar260 = (float)((uint)fStack_828 ^ (uint)auVar204._24_4_);
      auVar237._0_4_ = local_840 ^ (uint)local_9c0._0_4_;
      auVar237._4_4_ = uStack_83c ^ (uint)local_9c0._4_4_;
      auVar237._8_4_ = uStack_838 ^ (uint)local_9c0._8_4_;
      auVar237._12_4_ = uStack_834 ^ (uint)local_9c0._12_4_;
      auVar237._16_4_ = (uint)fStack_830 ^ (uint)local_9c0._16_4_;
      auVar237._20_4_ = (uint)fStack_82c ^ (uint)local_9c0._20_4_;
      auVar237._24_4_ = (uint)fStack_828 ^ (uint)local_9c0._24_4_;
      auVar237._28_4_ = uStack_824 ^ local_9c0._28_4_;
      auVar280 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar147 = vsubps_avx(auVar280,local_760);
      auVar280 = vsubps_avx(auVar280,local_a40);
      auVar41._4_4_ = auVar280._4_4_ * fVar243;
      auVar41._0_4_ = auVar280._0_4_ * fVar240;
      auVar41._8_4_ = auVar280._8_4_ * fVar220;
      auVar41._12_4_ = auVar280._12_4_ * fVar224;
      auVar41._16_4_ = auVar280._16_4_ * fVar206;
      auVar41._20_4_ = auVar280._20_4_ * fVar207;
      auVar41._24_4_ = auVar280._24_4_ * fVar260;
      auVar41._28_4_ = auVar280._28_4_;
      auVar100 = vfmadd231ps_fma(auVar41,auVar237,auVar147);
      uStack_b64 = auVar144._28_4_;
      auVar251._0_4_ = local_840 ^ (uint)auVar144._0_4_;
      auVar251._4_4_ = uStack_83c ^ (uint)auVar144._4_4_;
      auVar251._8_4_ = uStack_838 ^ (uint)auVar144._8_4_;
      auVar251._12_4_ = uStack_834 ^ (uint)auVar144._12_4_;
      auVar251._16_4_ = (uint)fStack_830 ^ (uint)auVar144._16_4_;
      auVar251._20_4_ = (uint)fStack_82c ^ (uint)auVar144._20_4_;
      auVar251._24_4_ = (uint)fStack_828 ^ (uint)auVar144._24_4_;
      auVar251._28_4_ = uStack_824 ^ uStack_b64;
      auVar147 = vsubps_avx(ZEXT1232(ZEXT812(0)) << 0x20,local_a20);
      auVar99 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar251,auVar147);
      auVar42._4_4_ = fVar243 * fVar242;
      auVar42._0_4_ = fVar240 * fVar231;
      auVar42._8_4_ = fVar220 * fVar210;
      auVar42._12_4_ = fVar224 * fVar223;
      auVar42._16_4_ = fVar206 * fVar226;
      auVar42._20_4_ = fVar207 * fVar230;
      auVar42._24_4_ = fVar260 * fVar245;
      auVar42._28_4_ = uStack_824 ^ auVar204._28_4_;
      auVar100 = vfmadd231ps_fma(auVar42,_local_7e0,auVar237);
      auVar155 = vfmadd231ps_fma(ZEXT1632(auVar100),_local_800,auVar251);
      auVar147 = vandps_avx(auVar56,ZEXT1632(auVar155));
      auVar294._8_4_ = 0x3f800000;
      auVar294._0_8_ = 0x3f8000003f800000;
      auVar294._12_4_ = 0x3f800000;
      auVar294._16_4_ = 0x3f800000;
      auVar294._20_4_ = 0x3f800000;
      auVar294._24_4_ = 0x3f800000;
      auVar294._28_4_ = 0x3f800000;
      auVar144 = vrcpps_avx(ZEXT1632(auVar155));
      auVar118._8_4_ = 0x219392ef;
      auVar118._0_8_ = 0x219392ef219392ef;
      auVar118._12_4_ = 0x219392ef;
      auVar118._16_4_ = 0x219392ef;
      auVar118._20_4_ = 0x219392ef;
      auVar118._24_4_ = 0x219392ef;
      auVar118._28_4_ = 0x219392ef;
      auVar280 = vcmpps_avx(auVar147,auVar118,1);
      auVar239 = ZEXT3264(auVar280);
      auVar204 = ZEXT1632(auVar155);
      auVar100 = vfnmadd213ps_fma(auVar144,auVar204,auVar294);
      auVar100 = vfmadd132ps_fma(ZEXT1632(auVar100),auVar144,auVar144);
      auVar252._0_4_ = auVar155._0_4_ ^ local_840;
      auVar252._4_4_ = auVar155._4_4_ ^ uStack_83c;
      auVar252._8_4_ = auVar155._8_4_ ^ uStack_838;
      auVar252._12_4_ = auVar155._12_4_ ^ uStack_834;
      auVar252._16_4_ = fStack_830;
      auVar252._20_4_ = fStack_82c;
      auVar252._24_4_ = fStack_828;
      auVar252._28_4_ = uStack_824;
      auVar259 = ZEXT3264(auVar252);
      auVar43._4_4_ = auVar100._4_4_ * (float)(auVar99._4_4_ ^ uStack_83c);
      auVar43._0_4_ = auVar100._0_4_ * (float)(auVar99._0_4_ ^ local_840);
      auVar43._8_4_ = auVar100._8_4_ * (float)(auVar99._8_4_ ^ uStack_838);
      auVar43._12_4_ = auVar100._12_4_ * (float)(auVar99._12_4_ ^ uStack_834);
      auVar43._16_4_ = fStack_830 * 0.0;
      auVar43._20_4_ = fStack_82c * 0.0;
      auVar43._24_4_ = fStack_828 * 0.0;
      auVar43._28_4_ = uStack_824;
      auVar147 = vcmpps_avx(auVar204,auVar252,1);
      auVar147 = vorps_avx(auVar147,auVar280);
      auVar119._8_4_ = 0xff800000;
      auVar119._0_8_ = 0xff800000ff800000;
      auVar119._12_4_ = 0xff800000;
      auVar119._16_4_ = 0xff800000;
      auVar119._20_4_ = 0xff800000;
      auVar119._24_4_ = 0xff800000;
      auVar119._28_4_ = 0xff800000;
      auVar147 = vblendvps_avx(auVar43,auVar119,auVar147);
      auVar283 = ZEXT3264(auVar147);
      local_820 = vmaxps_avx(auVar255,auVar147);
      auVar147 = vcmpps_avx(auVar204,auVar252,6);
      auVar147 = vorps_avx(auVar280,auVar147);
      auVar120._8_4_ = 0x7f800000;
      auVar120._0_8_ = 0x7f8000007f800000;
      auVar120._12_4_ = 0x7f800000;
      auVar120._16_4_ = 0x7f800000;
      auVar120._20_4_ = 0x7f800000;
      auVar120._24_4_ = 0x7f800000;
      auVar120._28_4_ = 0x7f800000;
      auVar147 = vblendvps_avx(auVar43,auVar120,auVar147);
      auVar114 = vandps_avx(local_260,auVar114);
      local_340 = vminps_avx(auVar121,auVar147);
      auVar147 = vcmpps_avx(local_820,local_340,2);
      auVar280 = auVar114 & auVar147;
      if ((((((((auVar280 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar280 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar280 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar280 >> 0x7f,0) != '\0') ||
            (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar280 >> 0xbf,0) != '\0') ||
          (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar280[0x1f] < '\0') {
        auVar80._4_4_ = fStack_2bc;
        auVar80._0_4_ = local_2c0;
        auVar80._8_4_ = fStack_2b8;
        auVar80._12_4_ = fStack_2b4;
        auVar80._16_4_ = uStack_2b0;
        auVar80._20_4_ = uStack_2ac;
        auVar80._24_4_ = uStack_2a8;
        auVar80._28_4_ = uStack_2a4;
        auVar280 = vminps_avx(auVar80,auVar294);
        auVar229 = ZEXT864(0) << 0x20;
        auVar280 = vmaxps_avx(auVar280,ZEXT832(0) << 0x20);
        auVar79._4_4_ = fStack_2dc;
        auVar79._0_4_ = local_2e0;
        auVar79._8_4_ = fStack_2d8;
        auVar79._12_4_ = fStack_2d4;
        auVar79._16_4_ = uStack_2d0;
        auVar79._20_4_ = uStack_2cc;
        auVar79._24_4_ = uStack_2c8;
        auVar79._28_4_ = uStack_2c4;
        auVar255 = vminps_avx(auVar79,auVar294);
        auVar255 = vmaxps_avx(auVar255,ZEXT832(0) << 0x20);
        fVar240 = DAT_01faff40._28_4_;
        auVar44._4_4_ = (auVar280._4_4_ + DAT_01faff40._4_4_) * 0.125;
        auVar44._0_4_ = (auVar280._0_4_ + (float)DAT_01faff40) * 0.125;
        auVar44._8_4_ = (auVar280._8_4_ + DAT_01faff40._8_4_) * 0.125;
        auVar44._12_4_ = (auVar280._12_4_ + DAT_01faff40._12_4_) * 0.125;
        auVar44._16_4_ = (auVar280._16_4_ + DAT_01faff40._16_4_) * 0.125;
        auVar44._20_4_ = (auVar280._20_4_ + DAT_01faff40._20_4_) * 0.125;
        auVar44._24_4_ = (auVar280._24_4_ + DAT_01faff40._24_4_) * 0.125;
        auVar44._28_4_ = auVar280._28_4_ + fVar240;
        auVar100 = vfmadd213ps_fma(auVar44,auVar115,local_7a0);
        auVar45._4_4_ = (auVar255._4_4_ + DAT_01faff40._4_4_) * 0.125;
        auVar45._0_4_ = (auVar255._0_4_ + (float)DAT_01faff40) * 0.125;
        auVar45._8_4_ = (auVar255._8_4_ + DAT_01faff40._8_4_) * 0.125;
        auVar45._12_4_ = (auVar255._12_4_ + DAT_01faff40._12_4_) * 0.125;
        auVar45._16_4_ = (auVar255._16_4_ + DAT_01faff40._16_4_) * 0.125;
        auVar45._20_4_ = (auVar255._20_4_ + DAT_01faff40._20_4_) * 0.125;
        auVar45._24_4_ = (auVar255._24_4_ + DAT_01faff40._24_4_) * 0.125;
        auVar45._28_4_ = auVar255._28_4_ + fVar240;
        auVar99 = vfmadd213ps_fma(auVar45,auVar115,local_7a0);
        auVar280 = vminps_avx(auVar217,auVar228);
        auVar255 = vminps_avx(auVar15,auVar16);
        auVar280 = vminps_avx(auVar280,auVar255);
        auVar280 = vsubps_avx(auVar280,local_600);
        auVar114 = vandps_avx(auVar147,auVar114);
        local_1a0 = ZEXT1632(auVar100);
        local_1c0 = ZEXT1632(auVar99);
        auVar46._4_4_ = auVar280._4_4_ * 0.99999976;
        auVar46._0_4_ = auVar280._0_4_ * 0.99999976;
        auVar46._8_4_ = auVar280._8_4_ * 0.99999976;
        auVar46._12_4_ = auVar280._12_4_ * 0.99999976;
        auVar46._16_4_ = auVar280._16_4_ * 0.99999976;
        auVar46._20_4_ = auVar280._20_4_ * 0.99999976;
        auVar46._24_4_ = auVar280._24_4_ * 0.99999976;
        auVar46._28_4_ = auVar280._28_4_;
        auVar147 = vmaxps_avx(ZEXT832(0) << 0x20,auVar46);
        auVar47._4_4_ = auVar147._4_4_ * auVar147._4_4_;
        auVar47._0_4_ = auVar147._0_4_ * auVar147._0_4_;
        auVar47._8_4_ = auVar147._8_4_ * auVar147._8_4_;
        auVar47._12_4_ = auVar147._12_4_ * auVar147._12_4_;
        auVar47._16_4_ = auVar147._16_4_ * auVar147._16_4_;
        auVar47._20_4_ = auVar147._20_4_ * auVar147._20_4_;
        auVar47._24_4_ = auVar147._24_4_ * auVar147._24_4_;
        auVar47._28_4_ = auVar147._28_4_;
        auVar280 = vsubps_avx(auVar13,auVar47);
        auVar48._4_4_ = auVar280._4_4_ * (float)local_680._4_4_;
        auVar48._0_4_ = auVar280._0_4_ * (float)local_680._0_4_;
        auVar48._8_4_ = auVar280._8_4_ * fStack_678;
        auVar48._12_4_ = auVar280._12_4_ * fStack_674;
        auVar48._16_4_ = auVar280._16_4_ * fStack_670;
        auVar48._20_4_ = auVar280._20_4_ * fStack_66c;
        auVar48._24_4_ = auVar280._24_4_ * fStack_668;
        auVar48._28_4_ = auVar147._28_4_;
        auVar13 = vsubps_avx(local_5e0,auVar48);
        auVar147 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,5);
        if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar147 >> 0x7f,0) == '\0') &&
              (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar147 >> 0xbf,0) == '\0') &&
            (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar147[0x1f]) {
          auVar121 = SUB6432(ZEXT864(0),0) << 0x20;
          local_8a0 = ZEXT832(0) << 0x20;
          _local_8c0 = ZEXT832(0) << 0x20;
          auVar144 = ZEXT832(0) << 0x40;
          auVar238._8_4_ = 0x7f800000;
          auVar238._0_8_ = 0x7f8000007f800000;
          auVar238._12_4_ = 0x7f800000;
          auVar238._16_4_ = 0x7f800000;
          auVar238._20_4_ = 0x7f800000;
          auVar238._24_4_ = 0x7f800000;
          auVar238._28_4_ = 0x7f800000;
          auVar253._8_4_ = 0xff800000;
          auVar253._0_8_ = 0xff800000ff800000;
          auVar253._12_4_ = 0xff800000;
          auVar253._16_4_ = 0xff800000;
          auVar253._20_4_ = 0xff800000;
          auVar253._24_4_ = 0xff800000;
          auVar253._28_4_ = 0xff800000;
          _local_880 = local_8a0;
        }
        else {
          auVar121 = vsqrtps_avx(auVar13);
          local_320 = auVar282;
          auVar254._0_4_ = fVar244 + fVar244;
          auVar254._4_4_ = fVar221 + fVar221;
          auVar254._8_4_ = fVar225 + fVar225;
          auVar254._12_4_ = fVar261 + fVar261;
          auVar254._16_4_ = fVar262 + fVar262;
          auVar254._20_4_ = fVar208 + fVar208;
          auVar254._24_4_ = fVar284 + fVar284;
          auVar254._28_4_ = fVar193 + fVar193;
          auVar255 = vrcpps_avx(auVar254);
          auVar100 = vfnmadd213ps_fma(auVar254,auVar255,auVar294);
          auVar100 = vfmadd132ps_fma(ZEXT1632(auVar100),auVar255,auVar255);
          auVar281._0_4_ = local_a80._0_4_ ^ local_840;
          auVar281._4_4_ = (uint)local_a80._4_4_ ^ uStack_83c;
          auVar281._8_4_ = (uint)local_a80._8_4_ ^ uStack_838;
          auVar281._12_4_ = (uint)local_a80._12_4_ ^ uStack_834;
          auVar281._16_4_ = (uint)local_a80._16_4_ ^ (uint)fStack_830;
          auVar281._20_4_ = (uint)local_a80._20_4_ ^ (uint)fStack_82c;
          auVar281._24_4_ = (uint)local_a80._24_4_ ^ (uint)fStack_828;
          auVar281._28_4_ = (uint)local_a80._28_4_ ^ uStack_824;
          auVar255 = vsubps_avx(auVar281,auVar121);
          auVar144 = vsubps_avx(auVar121,local_a80);
          fVar193 = auVar255._0_4_ * auVar100._0_4_;
          fVar243 = auVar255._4_4_ * auVar100._4_4_;
          auVar49._4_4_ = fVar243;
          auVar49._0_4_ = fVar193;
          fVar244 = auVar255._8_4_ * auVar100._8_4_;
          auVar49._8_4_ = fVar244;
          fVar220 = auVar255._12_4_ * auVar100._12_4_;
          auVar49._12_4_ = fVar220;
          fVar221 = auVar255._16_4_ * 0.0;
          auVar49._16_4_ = fVar221;
          fVar224 = auVar255._20_4_ * 0.0;
          auVar49._20_4_ = fVar224;
          fVar225 = auVar255._24_4_ * 0.0;
          auVar49._24_4_ = fVar225;
          auVar49._28_4_ = auVar121._28_4_;
          fVar206 = auVar100._0_4_ * auVar144._0_4_;
          fVar207 = auVar100._4_4_ * auVar144._4_4_;
          auVar50._4_4_ = fVar207;
          auVar50._0_4_ = fVar206;
          fVar260 = auVar100._8_4_ * auVar144._8_4_;
          auVar50._8_4_ = fVar260;
          fVar261 = auVar100._12_4_ * auVar144._12_4_;
          auVar50._12_4_ = fVar261;
          fVar262 = auVar144._16_4_ * 0.0;
          auVar50._16_4_ = fVar262;
          fVar208 = auVar144._20_4_ * 0.0;
          auVar50._20_4_ = fVar208;
          fVar284 = auVar144._24_4_ * 0.0;
          auVar50._24_4_ = fVar284;
          auVar50._28_4_ = auVar255._28_4_;
          auVar100 = vfmadd213ps_fma(auVar273,auVar49,auVar296);
          auVar99 = vfmadd213ps_fma(auVar273,auVar50,auVar296);
          auVar255 = ZEXT1632(CONCAT412(fVar222 * auVar100._12_4_,
                                        CONCAT48(fVar209 * auVar100._8_4_,
                                                 CONCAT44(fVar241 * auVar100._4_4_,
                                                          fVar96 * auVar100._0_4_))));
          auVar121 = ZEXT1632(CONCAT412(fVar222 * auVar99._12_4_,
                                        CONCAT48(fVar209 * auVar99._8_4_,
                                                 CONCAT44(fVar241 * auVar99._4_4_,
                                                          fVar96 * auVar99._0_4_))));
          auVar100 = vfmadd213ps_fma(local_660,auVar255,auVar116);
          auVar99 = vfmadd213ps_fma(local_660,auVar121,auVar116);
          auVar155 = vfmadd213ps_fma(local_240,auVar255,auVar168);
          auVar107 = vfmadd213ps_fma(local_240,auVar121,auVar168);
          auVar98 = vfmadd213ps_fma(auVar255,local_640,local_620);
          auVar130 = vfmadd213ps_fma(local_640,auVar121,local_620);
          auVar51._4_4_ = (float)local_800._4_4_ * fVar243;
          auVar51._0_4_ = (float)local_800._0_4_ * fVar193;
          auVar51._8_4_ = fStack_7f8 * fVar244;
          auVar51._12_4_ = fStack_7f4 * fVar220;
          auVar51._16_4_ = fStack_7f0 * fVar221;
          auVar51._20_4_ = fStack_7ec * fVar224;
          auVar51._24_4_ = fStack_7e8 * fVar225;
          auVar51._28_4_ = 0;
          auVar121 = vsubps_avx(auVar51,ZEXT1632(auVar100));
          auVar84._4_4_ = (float)local_7e0._4_4_ * fVar243;
          auVar84._0_4_ = (float)local_7e0._0_4_ * fVar193;
          auVar84._8_4_ = fStack_7d8 * fVar244;
          auVar84._12_4_ = fStack_7d4 * fVar220;
          auVar84._16_4_ = fStack_7d0 * fVar221;
          auVar84._20_4_ = fStack_7cc * fVar224;
          auVar84._24_4_ = fStack_7c8 * fVar225;
          auVar84._28_4_ = fVar240;
          auVar144 = vsubps_avx(auVar84,ZEXT1632(auVar155));
          auVar169._0_4_ = fVar231 * fVar193;
          auVar169._4_4_ = fVar242 * fVar243;
          auVar169._8_4_ = fVar210 * fVar244;
          auVar169._12_4_ = fVar223 * fVar220;
          auVar169._16_4_ = fVar226 * fVar221;
          auVar169._20_4_ = fVar230 * fVar224;
          auVar169._24_4_ = fVar245 * fVar225;
          auVar169._28_4_ = 0;
          auVar255 = vsubps_avx(auVar169,ZEXT1632(auVar98));
          auVar229 = ZEXT3264(auVar255);
          auVar256._0_4_ = (float)local_800._0_4_ * fVar206;
          auVar256._4_4_ = (float)local_800._4_4_ * fVar207;
          auVar256._8_4_ = fStack_7f8 * fVar260;
          auVar256._12_4_ = fStack_7f4 * fVar261;
          auVar256._16_4_ = fStack_7f0 * fVar262;
          auVar256._20_4_ = fStack_7ec * fVar208;
          auVar256._24_4_ = fStack_7e8 * fVar284;
          auVar256._28_4_ = 0;
          _local_880 = vsubps_avx(auVar256,ZEXT1632(auVar99));
          auVar52._4_4_ = (float)local_7e0._4_4_ * fVar207;
          auVar52._0_4_ = (float)local_7e0._0_4_ * fVar206;
          auVar52._8_4_ = fStack_7d8 * fVar260;
          auVar52._12_4_ = fStack_7d4 * fVar261;
          auVar52._16_4_ = fStack_7d0 * fVar262;
          auVar52._20_4_ = fStack_7cc * fVar208;
          auVar52._24_4_ = fStack_7c8 * fVar284;
          auVar52._28_4_ = local_880._28_4_;
          local_8a0 = vsubps_avx(auVar52,ZEXT1632(auVar107));
          auVar53._4_4_ = fVar242 * fVar207;
          auVar53._0_4_ = fVar231 * fVar206;
          auVar53._8_4_ = fVar210 * fVar260;
          auVar53._12_4_ = fVar223 * fVar261;
          auVar53._16_4_ = fVar226 * fVar262;
          auVar53._20_4_ = fVar230 * fVar208;
          auVar53._24_4_ = fVar245 * fVar284;
          auVar53._28_4_ = local_8a0._28_4_;
          _local_8c0 = vsubps_avx(auVar53,ZEXT1632(auVar130));
          auVar274 = ZEXT864(0) << 0x20;
          auVar255 = vcmpps_avx(auVar13,_DAT_01faff00,5);
          auVar257._8_4_ = 0x7f800000;
          auVar257._0_8_ = 0x7f8000007f800000;
          auVar257._12_4_ = 0x7f800000;
          auVar257._16_4_ = 0x7f800000;
          auVar257._20_4_ = 0x7f800000;
          auVar257._24_4_ = 0x7f800000;
          auVar257._28_4_ = 0x7f800000;
          auVar238 = vblendvps_avx(auVar257,auVar49,auVar255);
          auVar57._4_4_ = uStack_85c;
          auVar57._0_4_ = local_860;
          auVar57._8_4_ = uStack_858;
          auVar57._12_4_ = uStack_854;
          auVar57._16_4_ = uStack_850;
          auVar57._20_4_ = uStack_84c;
          auVar57._24_4_ = uStack_848;
          auVar57._28_4_ = uStack_844;
          auVar13 = vandps_avx(auVar57,local_300);
          auVar13 = vmaxps_avx(local_560,auVar13);
          auVar54._4_4_ = auVar13._4_4_ * 1.9073486e-06;
          auVar54._0_4_ = auVar13._0_4_ * 1.9073486e-06;
          auVar54._8_4_ = auVar13._8_4_ * 1.9073486e-06;
          auVar54._12_4_ = auVar13._12_4_ * 1.9073486e-06;
          auVar54._16_4_ = auVar13._16_4_ * 1.9073486e-06;
          auVar54._20_4_ = auVar13._20_4_ * 1.9073486e-06;
          auVar54._24_4_ = auVar13._24_4_ * 1.9073486e-06;
          auVar54._28_4_ = auVar13._28_4_;
          auVar13 = vandps_avx(auVar57,auVar282);
          auVar13 = vcmpps_avx(auVar13,auVar54,1);
          auVar258._8_4_ = 0xff800000;
          auVar258._0_8_ = 0xff800000ff800000;
          auVar258._12_4_ = 0xff800000;
          auVar258._16_4_ = 0xff800000;
          auVar258._20_4_ = 0xff800000;
          auVar258._24_4_ = 0xff800000;
          auVar258._28_4_ = 0xff800000;
          auVar253 = vblendvps_avx(auVar258,auVar50,auVar255);
          auVar204 = auVar255 & auVar13;
          auVar282 = auVar50;
          if ((((((((auVar204 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar204 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar204 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar204 >> 0x7f,0) != '\0') ||
                (auVar204 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar204 >> 0xbf,0) != '\0') ||
              (auVar204 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar204[0x1f] < '\0') {
            auVar147 = vandps_avx(auVar13,auVar255);
            auVar13 = vcmpps_avx(auVar280,ZEXT832(0) << 0x20,2);
            auVar282._8_4_ = 0xff800000;
            auVar282._0_8_ = 0xff800000ff800000;
            auVar282._12_4_ = 0xff800000;
            auVar282._16_4_ = 0xff800000;
            auVar282._20_4_ = 0xff800000;
            auVar282._24_4_ = 0xff800000;
            auVar282._28_4_ = 0xff800000;
            auVar289._8_4_ = 0x7f800000;
            auVar289._0_8_ = 0x7f8000007f800000;
            auVar289._12_4_ = 0x7f800000;
            auVar289._16_4_ = 0x7f800000;
            auVar289._20_4_ = 0x7f800000;
            auVar289._24_4_ = 0x7f800000;
            auVar289._28_4_ = 0x7f800000;
            auVar280 = vblendvps_avx(auVar289,auVar282,auVar13);
            auVar100 = vpackssdw_avx(auVar147._0_16_,auVar147._16_16_);
            auVar204 = vpmovsxwd_avx2(auVar100);
            auVar238 = vblendvps_avx(auVar238,auVar280,auVar204);
            auVar280 = vblendvps_avx(auVar282,auVar289,auVar13);
            auVar274 = ZEXT3264(auVar280);
            auVar253 = vblendvps_avx(auVar253,auVar280,auVar204);
            auVar219._0_8_ = auVar147._0_8_ ^ 0xffffffffffffffff;
            auVar219._8_4_ = auVar147._8_4_ ^ 0xffffffff;
            auVar219._12_4_ = auVar147._12_4_ ^ 0xffffffff;
            auVar219._16_4_ = auVar147._16_4_ ^ 0xffffffff;
            auVar219._20_4_ = auVar147._20_4_ ^ 0xffffffff;
            auVar219._24_4_ = auVar147._24_4_ ^ 0xffffffff;
            auVar219._28_4_ = auVar147._28_4_ ^ 0xffffffff;
            auVar147 = vorps_avx(auVar13,auVar219);
            auVar147 = vandps_avx(auVar255,auVar147);
          }
        }
        auVar283 = ZEXT3264(auVar282);
        auVar259 = ZEXT3264(auVar253);
        auVar290 = ZEXT3264(local_a60);
        auVar266 = ZEXT3264(local_820);
        local_3a0 = local_820;
        local_380 = vminps_avx(local_340,auVar238);
        local_360 = vmaxps_avx(local_820,auVar253);
        auVar239 = ZEXT3264(local_360);
        auVar280 = vcmpps_avx(local_820,local_380,2);
        local_5e0 = vandps_avx(auVar280,auVar114);
        auVar280 = vcmpps_avx(local_360,local_340,2);
        local_620 = vandps_avx(auVar280,auVar114);
        auVar114 = vorps_avx(local_620,local_5e0);
        if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar114 >> 0x7f,0) != '\0') ||
              (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar114 >> 0xbf,0) != '\0') ||
            (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar114[0x1f] < '\0') {
          _local_680 = local_360;
          auVar280 = _local_680;
          local_640._0_8_ = auVar147._0_8_ ^ 0xffffffffffffffff;
          local_640._8_4_ = auVar147._8_4_ ^ 0xffffffff;
          local_640._12_4_ = auVar147._12_4_ ^ 0xffffffff;
          local_640._16_4_ = auVar147._16_4_ ^ 0xffffffff;
          local_640._20_4_ = auVar147._20_4_ ^ 0xffffffff;
          local_640._24_4_ = auVar147._24_4_ ^ 0xffffffff;
          local_640._28_4_ = auVar147._28_4_ ^ 0xffffffff;
          auVar175._0_4_ = fVar231 * auVar229._0_4_;
          auVar175._4_4_ = fVar242 * auVar229._4_4_;
          auVar175._8_4_ = fVar210 * auVar229._8_4_;
          auVar175._12_4_ = fVar223 * auVar229._12_4_;
          auVar175._16_4_ = fVar226 * auVar229._16_4_;
          auVar175._20_4_ = fVar230 * auVar229._20_4_;
          auVar175._28_36_ = auVar229._28_36_;
          auVar175._24_4_ = fVar245 * auVar229._24_4_;
          auVar100 = vfmadd213ps_fma(auVar144,_local_7e0,auVar175._0_32_);
          auVar100 = vfmadd213ps_fma(auVar121,_local_800,ZEXT1632(auVar100));
          auVar58._4_4_ = uStack_85c;
          auVar58._0_4_ = local_860;
          auVar58._8_4_ = uStack_858;
          auVar58._12_4_ = uStack_854;
          auVar58._16_4_ = uStack_850;
          auVar58._20_4_ = uStack_84c;
          auVar58._24_4_ = uStack_848;
          auVar58._28_4_ = uStack_844;
          auVar114 = vandps_avx(ZEXT1632(auVar100),auVar58);
          auVar145._8_4_ = 0x3e99999a;
          auVar145._0_8_ = 0x3e99999a3e99999a;
          auVar145._12_4_ = 0x3e99999a;
          auVar145._16_4_ = 0x3e99999a;
          auVar145._20_4_ = 0x3e99999a;
          auVar145._24_4_ = 0x3e99999a;
          auVar145._28_4_ = 0x3e99999a;
          auVar114 = vcmpps_avx(auVar114,auVar145,1);
          auVar114 = vorps_avx(auVar114,local_640);
          auVar146._8_4_ = 3;
          auVar146._0_8_ = 0x300000003;
          auVar146._12_4_ = 3;
          auVar146._16_4_ = 3;
          auVar146._20_4_ = 3;
          auVar146._24_4_ = 3;
          auVar146._28_4_ = 3;
          auVar170._8_4_ = 2;
          auVar170._0_8_ = 0x200000002;
          auVar170._12_4_ = 2;
          auVar170._16_4_ = 2;
          auVar170._20_4_ = 2;
          auVar170._24_4_ = 2;
          auVar170._28_4_ = 2;
          auVar114 = vblendvps_avx(auVar170,auVar146,auVar114);
          local_660._4_4_ = local_c08;
          local_660._0_4_ = local_c08;
          local_660._8_4_ = local_c08;
          local_660._12_4_ = local_c08;
          local_660._16_4_ = local_c08;
          local_660._20_4_ = local_c08;
          local_660._24_4_ = local_c08;
          local_660._28_4_ = local_c08;
          local_600 = vpcmpgtd_avx2(auVar114,local_660);
          local_5c0 = vpandn_avx2(local_600,local_5e0);
          auVar229 = ZEXT3264(local_5c0);
          auVar114 = local_5e0 & ~local_600;
          fStack_aec = auVar9._4_4_;
          fStack_ae8 = auVar9._8_4_;
          fStack_ae4 = auVar9._12_4_;
          if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar114 >> 0x7f,0) == '\0') &&
                (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar114 >> 0xbf,0) == '\0') &&
              (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar114[0x1f]) {
            auVar122._4_4_ = fVar275;
            auVar122._0_4_ = fVar275;
            auVar122._8_4_ = fVar275;
            auVar122._12_4_ = fVar275;
            auVar122._16_4_ = fVar275;
            auVar122._20_4_ = fVar275;
            auVar122._24_4_ = fVar275;
            auVar122._28_4_ = fVar275;
            local_680._0_4_ = local_360._0_4_;
            local_680._4_4_ = local_360._4_4_;
            fStack_678 = local_360._8_4_;
            fStack_674 = local_360._12_4_;
            fStack_670 = local_360._16_4_;
            fStack_66c = local_360._20_4_;
            fStack_668 = local_360._24_4_;
            fStack_664 = local_360._28_4_;
            fVar193 = (float)local_680._0_4_;
            fVar96 = (float)local_680._4_4_;
            fVar231 = fStack_678;
            fVar240 = fStack_674;
            fVar241 = fStack_670;
            fVar242 = fStack_66c;
            fVar243 = fStack_668;
            fVar244 = fStack_664;
            _local_680 = auVar280;
          }
          else {
            auVar99 = vminps_avx(auVar10,auVar12);
            auVar100 = vmaxps_avx(auVar10,auVar12);
            auVar155 = vminps_avx(auVar11,auVar9);
            auVar107 = vminps_avx(auVar99,auVar155);
            auVar99 = vmaxps_avx(auVar11,auVar9);
            auVar155 = vmaxps_avx(auVar100,auVar99);
            auVar100 = vandps_avx(auVar107,auVar232);
            auVar99 = vandps_avx(auVar155,auVar232);
            auVar100 = vmaxps_avx(auVar100,auVar99);
            auVar99 = vmovshdup_avx(auVar100);
            auVar99 = vmaxss_avx(auVar99,auVar100);
            auVar100 = vshufpd_avx(auVar100,auVar100,1);
            auVar100 = vmaxss_avx(auVar100,auVar99);
            fVar193 = auVar100._0_4_ * 1.9073486e-06;
            local_7c0 = vshufps_avx(auVar155,auVar155,0xff);
            local_980._4_4_ = local_820._4_4_ + (float)local_940._4_4_;
            local_980._0_4_ = local_820._0_4_ + (float)local_940._0_4_;
            fStack_978 = local_820._8_4_ + fStack_938;
            fStack_974 = local_820._12_4_ + fStack_934;
            fStack_970 = local_820._16_4_ + fStack_930;
            fStack_96c = local_820._20_4_ + fStack_92c;
            fStack_968 = local_820._24_4_ + fStack_928;
            fStack_964 = local_820._28_4_ + fStack_924;
            do {
              auVar123._8_4_ = 0x7f800000;
              auVar123._0_8_ = 0x7f8000007f800000;
              auVar123._12_4_ = 0x7f800000;
              auVar123._16_4_ = 0x7f800000;
              auVar123._20_4_ = 0x7f800000;
              auVar123._24_4_ = 0x7f800000;
              auVar123._28_4_ = 0x7f800000;
              auVar114 = auVar229._0_32_;
              auVar147 = vblendvps_avx(auVar123,local_820,auVar114);
              auVar280 = vshufps_avx(auVar147,auVar147,0xb1);
              auVar280 = vminps_avx(auVar147,auVar280);
              auVar13 = vshufpd_avx(auVar280,auVar280,5);
              auVar280 = vminps_avx(auVar280,auVar13);
              auVar13 = vpermpd_avx2(auVar280,0x4e);
              auVar280 = vminps_avx(auVar280,auVar13);
              auVar147 = vcmpps_avx(auVar147,auVar280,0);
              auVar280 = auVar114 & auVar147;
              if ((((((((auVar280 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar280 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar280 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar280 >> 0x7f,0) != '\0') ||
                    (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar280 >> 0xbf,0) != '\0') ||
                  (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar280[0x1f] < '\0') {
                auVar114 = vandps_avx(auVar147,auVar114);
              }
              uVar87 = vmovmskps_avx(auVar114);
              iVar17 = 0;
              for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
                iVar17 = iVar17 + 1;
              }
              uVar88 = iVar17 << 2;
              *(undefined4 *)(local_5c0 + uVar88) = 0;
              uVar87 = *(uint *)(local_1a0 + uVar88);
              uVar88 = *(uint *)(local_3a0 + uVar88);
              fVar96 = auVar6._0_4_;
              if ((float)local_9a0._0_4_ < 0.0) {
                fVar96 = sqrtf((float)local_9a0._0_4_);
              }
              local_780._0_4_ = fVar96 * 1.9073486e-06;
              auVar100 = vinsertps_avx(ZEXT416(uVar88),ZEXT416(uVar87),0x10);
              auVar266 = ZEXT1664(auVar100);
              lVar89 = 5;
              do {
                fVar243 = auVar266._0_4_;
                auVar101._4_4_ = fVar243;
                auVar101._0_4_ = fVar243;
                auVar101._8_4_ = fVar243;
                auVar101._12_4_ = fVar243;
                auVar99 = vfmadd213ps_fma(auVar101,local_990,_DAT_01f7aa10);
                local_a20._0_16_ = vmovshdup_avx(auVar266._0_16_);
                fVar244 = local_a20._0_4_;
                fVar242 = 1.0 - fVar244;
                auVar130 = SUB6416(ZEXT464(0x40400000),0);
                auVar98 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar155 = vfmadd213ss_fma(auVar130,local_a20._0_16_,auVar98);
                auVar100 = vfmadd213ss_fma(auVar155,ZEXT416((uint)(fVar244 * fVar244)),
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar107 = vfmadd213ss_fma(auVar130,ZEXT416((uint)fVar242),auVar98);
                auVar107 = vfmadd213ss_fma(auVar107,ZEXT416((uint)(fVar242 * fVar242)),
                                           SUB6416(ZEXT464(0x40000000),0));
                fVar96 = fVar242 * fVar242 * -fVar244 * 0.5;
                fVar231 = auVar100._0_4_ * 0.5;
                fVar240 = auVar107._0_4_ * 0.5;
                fVar241 = fVar244 * fVar244 * -fVar242 * 0.5;
                auVar176._0_4_ = fVar241 * fVar128;
                auVar176._4_4_ = fVar241 * fStack_aec;
                auVar176._8_4_ = fVar241 * fStack_ae8;
                auVar176._12_4_ = fVar241 * fStack_ae4;
                auVar196._4_4_ = fVar240;
                auVar196._0_4_ = fVar240;
                auVar196._8_4_ = fVar240;
                auVar196._12_4_ = fVar240;
                auVar100 = vfmadd132ps_fma(auVar196,auVar176,auVar11);
                auVar156._4_4_ = fVar231;
                auVar156._0_4_ = fVar231;
                auVar156._8_4_ = fVar231;
                auVar156._12_4_ = fVar231;
                auVar100 = vfmadd132ps_fma(auVar156,auVar100,auVar12);
                auVar177._4_4_ = fVar96;
                auVar177._0_4_ = fVar96;
                auVar177._8_4_ = fVar96;
                auVar177._12_4_ = fVar96;
                auVar100 = vfmadd132ps_fma(auVar177,auVar100,auVar10);
                auVar98 = vfmadd231ss_fma(auVar98,local_a20._0_16_,ZEXT416(0x41100000));
                auVar107 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),local_a20._0_16_,
                                           ZEXT416(0x40800000));
                local_a40._0_16_ = auVar107;
                local_760._0_16_ = auVar100;
                auVar100 = vsubps_avx(auVar99,auVar100);
                _local_9e0 = auVar100;
                auVar100 = vdpps_avx(auVar100,auVar100,0x7f);
                auVar99 = vfmadd213ss_fma(auVar130,local_a20._0_16_,ZEXT416(0xbf800000));
                fVar96 = auVar100._0_4_;
                if (fVar96 < 0.0) {
                  local_9c0._0_16_ = auVar98;
                  local_a80._0_4_ = fVar242 * -2.0;
                  auVar290._0_4_ = sqrtf(fVar96);
                  auVar290._4_60_ = extraout_var;
                  auVar155 = ZEXT416(auVar155._0_4_);
                  auVar107 = auVar290._0_16_;
                  fVar231 = (float)local_a80._0_4_;
                  auVar98 = local_9c0._0_16_;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar100,auVar100);
                  fVar231 = fVar242 * -2.0;
                }
                fVar240 = local_a20._0_4_;
                auVar130 = vfmadd213ss_fma(auVar155,ZEXT416((uint)(fVar240 + fVar240)),
                                           ZEXT416((uint)(fVar240 * fVar240 * 3.0)));
                auVar97 = SUB6416(ZEXT464(0x40000000),0);
                auVar155 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_a20._0_16_,auVar97);
                auVar165 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * fVar242 * -3.0)),
                                           ZEXT416((uint)(fVar242 + fVar242)),auVar155);
                auVar195 = vfnmadd231ss_fma(ZEXT416((uint)(fVar240 * (fVar242 + fVar242))),
                                            ZEXT416((uint)fVar242),ZEXT416((uint)fVar242));
                auVar155 = vfmadd213ss_fma(ZEXT416((uint)fVar231),local_a20._0_16_,
                                           ZEXT416((uint)(fVar244 * fVar244)));
                fVar231 = auVar165._0_4_ * 0.5;
                fVar240 = auVar155._0_4_ * 0.5;
                auVar157._0_4_ = fVar128 * fVar240;
                auVar157._4_4_ = fStack_aec * fVar240;
                auVar157._8_4_ = fStack_ae8 * fVar240;
                auVar157._12_4_ = fStack_ae4 * fVar240;
                auVar131._4_4_ = fVar231;
                auVar131._0_4_ = fVar231;
                auVar131._8_4_ = fVar231;
                auVar131._12_4_ = fVar231;
                auVar155 = vfmadd213ps_fma(auVar131,auVar11,auVar157);
                fVar231 = auVar195._0_4_ * 0.5;
                fVar240 = auVar130._0_4_ * 0.5;
                auVar158._4_4_ = fVar240;
                auVar158._0_4_ = fVar240;
                auVar158._8_4_ = fVar240;
                auVar158._12_4_ = fVar240;
                auVar155 = vfmadd213ps_fma(auVar158,auVar12,auVar155);
                auVar269._4_4_ = fVar231;
                auVar269._0_4_ = fVar231;
                auVar269._8_4_ = fVar231;
                auVar269._12_4_ = fVar231;
                auVar130 = vfmadd213ps_fma(auVar269,auVar10,auVar155);
                auVar165 = vfmadd213ss_fma(local_a20._0_16_,SUB6416(ZEXT464(0xc0400000),0),auVar97);
                local_b40 = auVar99._0_4_;
                auVar102._0_4_ = fVar128 * local_b40;
                auVar102._4_4_ = fStack_aec * local_b40;
                auVar102._8_4_ = fStack_ae8 * local_b40;
                auVar102._12_4_ = fStack_ae4 * local_b40;
                auVar132._4_4_ = local_a40._0_4_;
                auVar132._0_4_ = local_a40._0_4_;
                auVar132._8_4_ = local_a40._0_4_;
                auVar132._12_4_ = local_a40._0_4_;
                auVar99 = vfmadd213ps_fma(auVar132,auVar11,auVar102);
                uVar95 = auVar98._0_4_;
                auVar159._4_4_ = uVar95;
                auVar159._0_4_ = uVar95;
                auVar159._8_4_ = uVar95;
                auVar159._12_4_ = uVar95;
                auVar99 = vfmadd213ps_fma(auVar159,auVar12,auVar99);
                auVar155 = vdpps_avx(auVar130,auVar130,0x7f);
                uVar95 = auVar165._0_4_;
                auVar133._4_4_ = uVar95;
                auVar133._0_4_ = uVar95;
                auVar133._8_4_ = uVar95;
                auVar133._12_4_ = uVar95;
                auVar165 = vfmadd213ps_fma(auVar133,auVar10,auVar99);
                auVar99 = vblendps_avx(auVar155,_DAT_01f7aa10,0xe);
                auVar98 = vrsqrtss_avx(auVar99,auVar99);
                fVar241 = auVar155._0_4_;
                fVar231 = auVar98._0_4_;
                auVar98 = vdpps_avx(auVar130,auVar165,0x7f);
                fVar231 = fVar231 * 1.5 + fVar241 * -0.5 * fVar231 * fVar231 * fVar231;
                auVar134._0_4_ = auVar165._0_4_ * fVar241;
                auVar134._4_4_ = auVar165._4_4_ * fVar241;
                auVar134._8_4_ = auVar165._8_4_ * fVar241;
                auVar134._12_4_ = auVar165._12_4_ * fVar241;
                fVar240 = auVar98._0_4_;
                auVar215._0_4_ = auVar130._0_4_ * fVar240;
                auVar215._4_4_ = auVar130._4_4_ * fVar240;
                fVar242 = auVar130._8_4_;
                auVar215._8_4_ = fVar242 * fVar240;
                fVar244 = auVar130._12_4_;
                auVar215._12_4_ = fVar244 * fVar240;
                auVar98 = vsubps_avx(auVar134,auVar215);
                auVar99 = vrcpss_avx(auVar99,auVar99);
                auVar165 = vfnmadd213ss_fma(auVar99,auVar155,auVar97);
                fVar240 = auVar99._0_4_ * auVar165._0_4_;
                auVar99 = vmaxss_avx(ZEXT416((uint)fVar193),
                                     ZEXT416((uint)(fVar243 * (float)local_780._0_4_)));
                auVar283 = ZEXT1664(auVar99);
                auVar234._0_8_ = auVar130._0_8_ ^ 0x8000000080000000;
                auVar234._8_4_ = -fVar242;
                auVar234._12_4_ = -fVar244;
                auVar178._0_4_ = fVar231 * auVar98._0_4_ * fVar240;
                auVar178._4_4_ = fVar231 * auVar98._4_4_ * fVar240;
                auVar178._8_4_ = fVar231 * auVar98._8_4_ * fVar240;
                auVar178._12_4_ = fVar231 * auVar98._12_4_ * fVar240;
                auVar248._0_4_ = auVar130._0_4_ * fVar231;
                auVar248._4_4_ = auVar130._4_4_ * fVar231;
                auVar248._8_4_ = fVar242 * fVar231;
                auVar248._12_4_ = fVar244 * fVar231;
                local_a20._0_16_ = auVar130;
                local_a40._0_4_ = auVar99._0_4_;
                if (fVar241 < -fVar241) {
                  fVar231 = sqrtf(fVar241);
                  auVar283 = ZEXT464((uint)local_a40._0_4_);
                  auVar107 = ZEXT416(auVar107._0_4_);
                }
                else {
                  auVar99 = vsqrtss_avx(auVar155,auVar155);
                  fVar231 = auVar99._0_4_;
                }
                auVar259 = ZEXT1664(auVar248);
                auVar99 = vdpps_avx(_local_9e0,auVar248,0x7f);
                auVar165 = vfmadd213ss_fma(ZEXT416((uint)fVar193),auVar107,auVar283._0_16_);
                auVar155 = vdpps_avx(auVar234,auVar248,0x7f);
                auVar98 = vdpps_avx(_local_9e0,auVar178,0x7f);
                auVar130 = vdpps_avx(local_990,auVar248,0x7f);
                auVar165 = vfmadd213ss_fma(ZEXT416((uint)(auVar107._0_4_ + 1.0)),
                                           ZEXT416((uint)(fVar193 / fVar231)),auVar165);
                auVar274 = ZEXT1664(auVar165);
                fVar231 = auVar155._0_4_ + auVar98._0_4_;
                fVar241 = auVar99._0_4_;
                auVar103._0_4_ = fVar241 * fVar241;
                auVar103._4_4_ = auVar99._4_4_ * auVar99._4_4_;
                auVar103._8_4_ = auVar99._8_4_ * auVar99._8_4_;
                auVar103._12_4_ = auVar99._12_4_ * auVar99._12_4_;
                auVar155 = vdpps_avx(_local_9e0,auVar234,0x7f);
                auVar98 = vsubps_avx(auVar100,auVar103);
                auVar107 = vrsqrtss_avx(auVar98,auVar98);
                fVar242 = auVar98._0_4_;
                fVar240 = auVar107._0_4_;
                fVar240 = fVar240 * 1.5 + fVar242 * -0.5 * fVar240 * fVar240 * fVar240;
                auVar107 = vdpps_avx(_local_9e0,local_990,0x7f);
                auVar155 = vfnmadd231ss_fma(auVar155,auVar99,ZEXT416((uint)fVar231));
                auVar107 = vfnmadd231ss_fma(auVar107,auVar99,auVar130);
                if (fVar242 < 0.0) {
                  local_9c0._0_16_ = auVar130;
                  local_a80._0_4_ = fVar240;
                  local_7a0._0_16_ = auVar107;
                  auVar259 = ZEXT1664(auVar248);
                  fVar242 = sqrtf(fVar242);
                  auVar274 = ZEXT464(auVar165._0_4_);
                  auVar283 = ZEXT464((uint)local_a40._0_4_);
                  fVar240 = (float)local_a80._0_4_;
                  auVar107 = local_7a0._0_16_;
                  auVar130 = local_9c0._0_16_;
                }
                else {
                  auVar98 = vsqrtss_avx(auVar98,auVar98);
                  fVar242 = auVar98._0_4_;
                }
                auVar290 = ZEXT3264(local_a60);
                auVar239 = ZEXT1664(local_a20._0_16_);
                auVar98 = vpermilps_avx(local_760._0_16_,0xff);
                fVar242 = fVar242 - auVar98._0_4_;
                auVar98 = vshufps_avx(local_a20._0_16_,local_a20._0_16_,0xff);
                auVar155 = vfmsub213ss_fma(auVar155,ZEXT416((uint)fVar240),auVar98);
                auVar179._0_8_ = auVar130._0_8_ ^ 0x8000000080000000;
                auVar179._8_4_ = auVar130._8_4_ ^ 0x80000000;
                auVar179._12_4_ = auVar130._12_4_ ^ 0x80000000;
                auVar197._0_8_ = auVar155._0_8_ ^ 0x8000000080000000;
                auVar197._8_4_ = auVar155._8_4_ ^ 0x80000000;
                auVar197._12_4_ = auVar155._12_4_ ^ 0x80000000;
                auVar165 = ZEXT416((uint)(auVar107._0_4_ * fVar240));
                auVar107 = vfmsub231ss_fma(ZEXT416((uint)(auVar130._0_4_ * auVar155._0_4_)),
                                           ZEXT416((uint)fVar231),auVar165);
                auVar155 = vinsertps_avx(auVar197,auVar165,0x1c);
                uVar95 = auVar107._0_4_;
                auVar198._4_4_ = uVar95;
                auVar198._0_4_ = uVar95;
                auVar198._8_4_ = uVar95;
                auVar198._12_4_ = uVar95;
                auVar155 = vdivps_avx(auVar155,auVar198);
                auVar107 = vinsertps_avx(ZEXT416((uint)fVar231),auVar179,0x10);
                auVar107 = vdivps_avx(auVar107,auVar198);
                auVar160._0_4_ = fVar241 * auVar155._0_4_ + fVar242 * auVar107._0_4_;
                auVar160._4_4_ = fVar241 * auVar155._4_4_ + fVar242 * auVar107._4_4_;
                auVar160._8_4_ = fVar241 * auVar155._8_4_ + fVar242 * auVar107._8_4_;
                auVar160._12_4_ = fVar241 * auVar155._12_4_ + fVar242 * auVar107._12_4_;
                auVar155 = vsubps_avx(auVar266._0_16_,auVar160);
                auVar266 = ZEXT1664(auVar155);
                auVar99 = vandps_avx(auVar99,auVar232);
                if (auVar99._0_4_ < auVar274._0_4_) {
                  auVar107 = vfmadd231ss_fma(ZEXT416((uint)(auVar283._0_4_ + auVar274._0_4_)),
                                             local_7c0,ZEXT416(0x36000000));
                  auVar99 = vandps_avx(ZEXT416((uint)fVar242),auVar232);
                  if (auVar99._0_4_ < auVar107._0_4_) {
                    fVar231 = auVar155._0_4_ + (float)local_8f0._0_4_;
                    auVar99 = ZEXT416((uint)fVar231);
                    if ((fVar94 <= fVar231) &&
                       (fVar240 = *(float *)(ray + k * 4 + 0x80), fVar231 <= fVar240)) {
                      auVar107 = vmovshdup_avx(auVar155);
                      fVar241 = auVar107._0_4_;
                      if ((0.0 <= fVar241) && (fVar241 <= 1.0)) {
                        auVar100 = vrsqrtss_avx(auVar100,auVar100);
                        fVar242 = auVar100._0_4_;
                        pGVar4 = (context->scene->geometries).items[uVar85].ptr;
                        if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          fVar96 = fVar242 * 1.5 + fVar96 * -0.5 * fVar242 * fVar242 * fVar242;
                          auVar180._0_4_ = fVar96 * (float)local_9e0._0_4_;
                          auVar180._4_4_ = fVar96 * (float)local_9e0._4_4_;
                          auVar180._8_4_ = fVar96 * fStack_9d8;
                          auVar180._12_4_ = fVar96 * fStack_9d4;
                          auVar130 = vfmadd213ps_fma(auVar98,auVar180,local_a20._0_16_);
                          auVar100 = vshufps_avx(auVar180,auVar180,0xc9);
                          auVar107 = vshufps_avx(local_a20._0_16_,local_a20._0_16_,0xc9);
                          auVar181._0_4_ = auVar180._0_4_ * auVar107._0_4_;
                          auVar181._4_4_ = auVar180._4_4_ * auVar107._4_4_;
                          auVar181._8_4_ = auVar180._8_4_ * auVar107._8_4_;
                          auVar181._12_4_ = auVar180._12_4_ * auVar107._12_4_;
                          auVar98 = vfmsub231ps_fma(auVar181,local_a20._0_16_,auVar100);
                          auVar100 = vshufps_avx(auVar98,auVar98,0xc9);
                          auVar107 = vshufps_avx(auVar130,auVar130,0xc9);
                          auVar98 = vshufps_avx(auVar98,auVar98,0xd2);
                          auVar104._0_4_ = auVar130._0_4_ * auVar98._0_4_;
                          auVar104._4_4_ = auVar130._4_4_ * auVar98._4_4_;
                          auVar104._8_4_ = auVar130._8_4_ * auVar98._8_4_;
                          auVar104._12_4_ = auVar130._12_4_ * auVar98._12_4_;
                          auVar100 = vfmsub231ps_fma(auVar104,auVar100,auVar107);
                          uVar95 = auVar100._0_4_;
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar231;
                            uVar3 = vextractps_avx(auVar100,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar3;
                            uVar3 = vextractps_avx(auVar100,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar3;
                            *(undefined4 *)(ray + k * 4 + 0xe0) = uVar95;
                            *(float *)(ray + k * 4 + 0xf0) = fVar241;
                            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                            *(int *)(ray + k * 4 + 0x110) = (int)local_960;
                            *(uint *)(ray + k * 4 + 0x120) = uVar85;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            local_6f0 = vshufps_avx(auVar155,auVar155,0x55);
                            auVar107 = vshufps_avx(auVar100,auVar100,0x55);
                            auStack_710 = vshufps_avx(auVar100,auVar100,0xaa);
                            local_720 = (RTCHitN  [16])auVar107;
                            local_700 = uVar95;
                            uStack_6fc = uVar95;
                            uStack_6f8 = uVar95;
                            uStack_6f4 = uVar95;
                            local_6e0 = ZEXT416(0) << 0x20;
                            local_6d0 = CONCAT44(uStack_73c,local_740);
                            uStack_6c8 = CONCAT44(uStack_734,uStack_738);
                            local_6c0._4_4_ = uStack_72c;
                            local_6c0._0_4_ = local_730;
                            local_6c0._8_4_ = uStack_728;
                            local_6c0._12_4_ = uStack_724;
                            vpcmpeqd_avx2(ZEXT1632(local_6c0),ZEXT1632(local_6c0));
                            uStack_6ac = context->user->instID[0];
                            local_6b0 = uStack_6ac;
                            uStack_6a8 = uStack_6ac;
                            uStack_6a4 = uStack_6ac;
                            uStack_6a0 = context->user->instPrimID[0];
                            uStack_69c = uStack_6a0;
                            uStack_698 = uStack_6a0;
                            uStack_694 = uStack_6a0;
                            *(float *)(ray + k * 4 + 0x80) = fVar231;
                            local_920._0_16_ = *local_9e8;
                            local_ab0.valid = (int *)local_920;
                            local_ab0.geometryUserPtr = pGVar4->userPtr;
                            local_ab0.context = context->user;
                            local_ab0.hit = local_720;
                            local_ab0.N = 4;
                            auVar100 = *local_9e8;
                            local_ab0.ray = (RTCRayN *)ray;
                            if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar239 = ZEXT1664(local_a20._0_16_);
                              auVar259 = ZEXT1664(auVar259._0_16_);
                              auVar266 = ZEXT1664(auVar155);
                              auVar274 = ZEXT1664(auVar274._0_16_);
                              auVar283 = ZEXT1664(auVar283._0_16_);
                              (*pGVar4->intersectionFilterN)(&local_ab0);
                              auVar152._8_56_ = extraout_var_01;
                              auVar152._0_8_ = extraout_XMM1_Qa;
                              auVar99 = auVar152._0_16_;
                              auVar290 = ZEXT3264(local_a60);
                              auVar100 = local_920._0_16_;
                            }
                            if (auVar100 == (undefined1  [16])0x0) {
                              auVar155 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar100 = vpcmpeqd_avx(auVar99,auVar99);
                              auVar155 = auVar155 ^ auVar100;
                            }
                            else {
                              p_Var5 = context->args->filter;
                              auVar99 = vpcmpeqd_avx(auVar107,auVar107);
                              if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar239 = ZEXT1664(auVar239._0_16_);
                                auVar259 = ZEXT1664(auVar259._0_16_);
                                auVar266 = ZEXT1664(auVar266._0_16_);
                                auVar274 = ZEXT1664(auVar274._0_16_);
                                auVar283 = ZEXT1664(auVar283._0_16_);
                                (*p_Var5)(&local_ab0);
                                auVar290 = ZEXT3264(local_a60);
                                auVar99 = vpcmpeqd_avx(auVar99,auVar99);
                                auVar100 = local_920._0_16_;
                              }
                              auVar107 = vpcmpeqd_avx(auVar100,_DAT_01f7aa10);
                              auVar155 = auVar107 ^ auVar99;
                              if (auVar100 != (undefined1  [16])0x0) {
                                auVar107 = auVar107 ^ auVar99;
                                auVar100 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                                    local_ab0.hit);
                                *(undefined1 (*) [16])(local_ab0.ray + 0xc0) = auVar100;
                                auVar100 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                                    (local_ab0.hit + 0x10));
                                *(undefined1 (*) [16])(local_ab0.ray + 0xd0) = auVar100;
                                auVar100 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                                    (local_ab0.hit + 0x20));
                                *(undefined1 (*) [16])(local_ab0.ray + 0xe0) = auVar100;
                                auVar100 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                                    (local_ab0.hit + 0x30));
                                *(undefined1 (*) [16])(local_ab0.ray + 0xf0) = auVar100;
                                auVar100 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                                    (local_ab0.hit + 0x40));
                                *(undefined1 (*) [16])(local_ab0.ray + 0x100) = auVar100;
                                auVar100 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                                    (local_ab0.hit + 0x50));
                                *(undefined1 (*) [16])(local_ab0.ray + 0x110) = auVar100;
                                auVar100 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                                    (local_ab0.hit + 0x60));
                                *(undefined1 (*) [16])(local_ab0.ray + 0x120) = auVar100;
                                auVar100 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                                    (local_ab0.hit + 0x70));
                                *(undefined1 (*) [16])(local_ab0.ray + 0x130) = auVar100;
                                auVar100 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                                    (local_ab0.hit + 0x80));
                                *(undefined1 (*) [16])(local_ab0.ray + 0x140) = auVar100;
                              }
                            }
                            auVar105._8_8_ = 0x100000001;
                            auVar105._0_8_ = 0x100000001;
                            if ((auVar105 & auVar155) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar240;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar89 = lVar89 + -1;
              } while (lVar89 != 0);
              auVar147 = local_5c0;
              uVar95 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar122._4_4_ = uVar95;
              auVar122._0_4_ = uVar95;
              auVar122._8_4_ = uVar95;
              auVar122._12_4_ = uVar95;
              auVar122._16_4_ = uVar95;
              auVar122._20_4_ = uVar95;
              auVar122._24_4_ = uVar95;
              auVar122._28_4_ = uVar95;
              auVar114 = vcmpps_avx(_local_980,auVar122,2);
              local_5c0 = vandps_avx(auVar114,local_5c0);
              auVar229 = ZEXT3264(local_5c0);
              auVar147 = auVar147 & auVar114;
            } while ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar147 >> 0x7f,0) != '\0') ||
                       (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar147 >> 0xbf,0) != '\0') ||
                     (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar147[0x1f] < '\0');
            auVar229 = ZEXT3264(local_360);
            fVar193 = (float)local_680._0_4_;
            fVar96 = (float)local_680._4_4_;
            fVar231 = fStack_678;
            fVar240 = fStack_674;
            fVar241 = fStack_670;
            fVar242 = fStack_66c;
            fVar243 = fStack_668;
            fVar244 = fStack_664;
          }
          auVar153._0_4_ = auVar290._0_4_ * (float)local_8c0._0_4_;
          auVar153._4_4_ = auVar290._4_4_ * (float)local_8c0._4_4_;
          auVar153._8_4_ = auVar290._8_4_ * fStack_8b8;
          auVar153._12_4_ = auVar290._12_4_ * fStack_8b4;
          auVar153._16_4_ = auVar290._16_4_ * fStack_8b0;
          auVar153._20_4_ = auVar290._20_4_ * fStack_8ac;
          auVar153._28_36_ = auVar229._28_36_;
          auVar153._24_4_ = auVar290._24_4_ * fStack_8a8;
          auVar100 = vfmadd213ps_fma(local_8a0,_local_7e0,auVar153._0_32_);
          auVar100 = vfmadd213ps_fma(_local_880,_local_800,ZEXT1632(auVar100));
          auVar59._4_4_ = uStack_85c;
          auVar59._0_4_ = local_860;
          auVar59._8_4_ = uStack_858;
          auVar59._12_4_ = uStack_854;
          auVar59._16_4_ = uStack_850;
          auVar59._20_4_ = uStack_84c;
          auVar59._24_4_ = uStack_848;
          auVar59._28_4_ = uStack_844;
          auVar114 = vandps_avx(ZEXT1632(auVar100),auVar59);
          auVar171._8_4_ = 0x3e99999a;
          auVar171._0_8_ = 0x3e99999a3e99999a;
          auVar171._12_4_ = 0x3e99999a;
          auVar171._16_4_ = 0x3e99999a;
          auVar171._20_4_ = 0x3e99999a;
          auVar171._24_4_ = 0x3e99999a;
          auVar171._28_4_ = 0x3e99999a;
          auVar114 = vcmpps_avx(auVar114,auVar171,1);
          auVar147 = vorps_avx(auVar114,local_640);
          auVar172._0_4_ = (float)local_940._0_4_ + fVar193;
          auVar172._4_4_ = (float)local_940._4_4_ + fVar96;
          auVar172._8_4_ = fStack_938 + fVar231;
          auVar172._12_4_ = fStack_934 + fVar240;
          auVar172._16_4_ = fStack_930 + fVar241;
          auVar172._20_4_ = fStack_92c + fVar242;
          auVar172._24_4_ = fStack_928 + fVar243;
          auVar172._28_4_ = fStack_924 + fVar244;
          auVar114 = vcmpps_avx(auVar172,auVar122,2);
          local_8a0 = vandps_avx(auVar114,local_620);
          auVar173._8_4_ = 3;
          auVar173._0_8_ = 0x300000003;
          auVar173._12_4_ = 3;
          auVar173._16_4_ = 3;
          auVar173._20_4_ = 3;
          auVar173._24_4_ = 3;
          auVar173._28_4_ = 3;
          auVar191._8_4_ = 2;
          auVar191._0_8_ = 0x200000002;
          auVar191._12_4_ = 2;
          auVar191._16_4_ = 2;
          auVar191._20_4_ = 2;
          auVar191._24_4_ = 2;
          auVar191._28_4_ = 2;
          auVar114 = vblendvps_avx(auVar191,auVar173,auVar147);
          _local_8c0 = vpcmpgtd_avx2(auVar114,local_660);
          auVar114 = vpandn_avx2(_local_8c0,local_8a0);
          auVar147 = local_8a0 & ~_local_8c0;
          local_920 = auVar114;
          if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar147 >> 0x7f,0) != '\0') ||
                (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar147 >> 0xbf,0) != '\0') ||
              (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar147[0x1f] < '\0') {
            auVar99 = vminps_avx(auVar10,auVar12);
            auVar100 = vmaxps_avx(auVar10,auVar12);
            auVar155 = vminps_avx(auVar11,auVar9);
            auVar107 = vminps_avx(auVar99,auVar155);
            auVar99 = vmaxps_avx(auVar11,auVar9);
            auVar155 = vmaxps_avx(auVar100,auVar99);
            auVar100 = vandps_avx(auVar107,auVar232);
            auVar99 = vandps_avx(auVar155,auVar232);
            auVar100 = vmaxps_avx(auVar100,auVar99);
            auVar99 = vmovshdup_avx(auVar100);
            auVar99 = vmaxss_avx(auVar99,auVar100);
            auVar100 = vshufpd_avx(auVar100,auVar100,1);
            auVar100 = vmaxss_avx(auVar100,auVar99);
            fVar193 = auVar100._0_4_ * 1.9073486e-06;
            local_7c0 = vshufps_avx(auVar155,auVar155,0xff);
            local_880._4_4_ = (float)local_940._4_4_ + local_360._4_4_;
            local_880._0_4_ = (float)local_940._0_4_ + local_360._0_4_;
            fStack_878 = fStack_938 + local_360._8_4_;
            fStack_874 = fStack_934 + local_360._12_4_;
            fStack_870 = fStack_930 + local_360._16_4_;
            fStack_86c = fStack_92c + local_360._20_4_;
            fStack_868 = fStack_928 + local_360._24_4_;
            fStack_864 = fStack_924 + local_360._28_4_;
            _local_980 = local_360;
            do {
              auVar124._8_4_ = 0x7f800000;
              auVar124._0_8_ = 0x7f8000007f800000;
              auVar124._12_4_ = 0x7f800000;
              auVar124._16_4_ = 0x7f800000;
              auVar124._20_4_ = 0x7f800000;
              auVar124._24_4_ = 0x7f800000;
              auVar124._28_4_ = 0x7f800000;
              auVar147 = vblendvps_avx(auVar124,_local_980,auVar114);
              auVar280 = vshufps_avx(auVar147,auVar147,0xb1);
              auVar280 = vminps_avx(auVar147,auVar280);
              auVar13 = vshufpd_avx(auVar280,auVar280,5);
              auVar280 = vminps_avx(auVar280,auVar13);
              auVar13 = vpermpd_avx2(auVar280,0x4e);
              auVar280 = vminps_avx(auVar280,auVar13);
              auVar280 = vcmpps_avx(auVar147,auVar280,0);
              auVar13 = auVar114 & auVar280;
              auVar147 = auVar114;
              if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar13 >> 0x7f,0) != '\0') ||
                    (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar13 >> 0xbf,0) != '\0') ||
                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar13[0x1f] < '\0') {
                auVar147 = vandps_avx(auVar280,auVar114);
              }
              uVar87 = vmovmskps_avx(auVar147);
              iVar17 = 0;
              for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
                iVar17 = iVar17 + 1;
              }
              uVar88 = iVar17 << 2;
              local_920 = auVar114;
              *(undefined4 *)(local_920 + uVar88) = 0;
              uVar87 = *(uint *)(local_1c0 + uVar88);
              uVar88 = *(uint *)(local_340 + uVar88);
              fVar96 = auVar7._0_4_;
              if ((float)local_9a0._0_4_ < 0.0) {
                fVar96 = sqrtf((float)local_9a0._0_4_);
              }
              local_780._0_4_ = fVar96 * 1.9073486e-06;
              auVar100 = vinsertps_avx(ZEXT416(uVar88),ZEXT416(uVar87),0x10);
              auVar266 = ZEXT1664(auVar100);
              lVar89 = 5;
              do {
                fVar243 = auVar266._0_4_;
                auVar106._4_4_ = fVar243;
                auVar106._0_4_ = fVar243;
                auVar106._8_4_ = fVar243;
                auVar106._12_4_ = fVar243;
                auVar99 = vfmadd213ps_fma(auVar106,local_990,_DAT_01f7aa10);
                local_a20._0_16_ = vmovshdup_avx(auVar266._0_16_);
                fVar244 = local_a20._0_4_;
                fVar242 = 1.0 - fVar244;
                auVar290 = ZEXT464((uint)fVar242);
                auVar130 = SUB6416(ZEXT464(0x40400000),0);
                auVar98 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar155 = vfmadd213ss_fma(auVar130,local_a20._0_16_,auVar98);
                auVar100 = vfmadd213ss_fma(auVar155,ZEXT416((uint)(fVar244 * fVar244)),
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar107 = vfmadd213ss_fma(auVar130,ZEXT416((uint)fVar242),auVar98);
                auVar107 = vfmadd213ss_fma(auVar107,ZEXT416((uint)(fVar242 * fVar242)),
                                           SUB6416(ZEXT464(0x40000000),0));
                fVar96 = fVar242 * fVar242 * -fVar244 * 0.5;
                fVar231 = auVar100._0_4_ * 0.5;
                fVar240 = auVar107._0_4_ * 0.5;
                fVar241 = fVar244 * fVar244 * -fVar242 * 0.5;
                auVar182._0_4_ = fVar241 * fVar128;
                auVar182._4_4_ = fVar241 * fStack_aec;
                auVar182._8_4_ = fVar241 * fStack_ae8;
                auVar182._12_4_ = fVar241 * fStack_ae4;
                auVar199._4_4_ = fVar240;
                auVar199._0_4_ = fVar240;
                auVar199._8_4_ = fVar240;
                auVar199._12_4_ = fVar240;
                auVar100 = vfmadd132ps_fma(auVar199,auVar182,auVar11);
                auVar161._4_4_ = fVar231;
                auVar161._0_4_ = fVar231;
                auVar161._8_4_ = fVar231;
                auVar161._12_4_ = fVar231;
                auVar100 = vfmadd132ps_fma(auVar161,auVar100,auVar12);
                auVar183._4_4_ = fVar96;
                auVar183._0_4_ = fVar96;
                auVar183._8_4_ = fVar96;
                auVar183._12_4_ = fVar96;
                auVar100 = vfmadd132ps_fma(auVar183,auVar100,auVar10);
                auVar98 = vfmadd231ss_fma(auVar98,local_a20._0_16_,ZEXT416(0x41100000));
                auVar107 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),local_a20._0_16_,
                                           ZEXT416(0x40800000));
                local_a40._0_16_ = auVar107;
                local_760._0_16_ = auVar100;
                auVar100 = vsubps_avx(auVar99,auVar100);
                _local_9e0 = auVar100;
                auVar100 = vdpps_avx(auVar100,auVar100,0x7f);
                auVar99 = vfmadd213ss_fma(auVar130,local_a20._0_16_,ZEXT416(0xbf800000));
                fVar96 = auVar100._0_4_;
                if (fVar96 < 0.0) {
                  local_9c0._0_16_ = auVar98;
                  local_a80._0_4_ = fVar242 * -2.0;
                  auVar259._0_4_ = sqrtf(fVar96);
                  auVar259._4_60_ = extraout_var_00;
                  auVar290 = ZEXT1664(ZEXT416((uint)fVar242));
                  auVar155 = ZEXT416(auVar155._0_4_);
                  auVar107 = auVar259._0_16_;
                  fVar231 = (float)local_a80._0_4_;
                  auVar98 = local_9c0._0_16_;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar100,auVar100);
                  fVar231 = fVar242 * -2.0;
                }
                fVar241 = auVar290._0_4_;
                fVar240 = local_a20._0_4_;
                auVar130 = vfmadd213ss_fma(auVar155,ZEXT416((uint)(fVar240 + fVar240)),
                                           ZEXT416((uint)(fVar240 * fVar240 * 3.0)));
                auVar97 = SUB6416(ZEXT464(0x40000000),0);
                auVar155 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_a20._0_16_,auVar97);
                auVar165 = vfmadd231ss_fma(ZEXT416((uint)(fVar241 * fVar241 * -3.0)),
                                           ZEXT416((uint)(fVar241 + fVar241)),auVar155);
                auVar129 = auVar290._0_16_;
                auVar195 = vfnmadd231ss_fma(ZEXT416((uint)(fVar240 * (fVar241 + fVar241))),auVar129,
                                            auVar129);
                auVar155 = vfmadd213ss_fma(ZEXT416((uint)fVar231),local_a20._0_16_,
                                           ZEXT416((uint)(fVar244 * fVar244)));
                fVar231 = auVar165._0_4_ * 0.5;
                fVar240 = auVar155._0_4_ * 0.5;
                auVar162._0_4_ = fVar128 * fVar240;
                auVar162._4_4_ = fStack_aec * fVar240;
                auVar162._8_4_ = fStack_ae8 * fVar240;
                auVar162._12_4_ = fStack_ae4 * fVar240;
                auVar135._4_4_ = fVar231;
                auVar135._0_4_ = fVar231;
                auVar135._8_4_ = fVar231;
                auVar135._12_4_ = fVar231;
                auVar155 = vfmadd213ps_fma(auVar135,auVar11,auVar162);
                fVar231 = auVar195._0_4_ * 0.5;
                fVar240 = auVar130._0_4_ * 0.5;
                auVar163._4_4_ = fVar240;
                auVar163._0_4_ = fVar240;
                auVar163._8_4_ = fVar240;
                auVar163._12_4_ = fVar240;
                auVar155 = vfmadd213ps_fma(auVar163,auVar12,auVar155);
                auVar270._4_4_ = fVar231;
                auVar270._0_4_ = fVar231;
                auVar270._8_4_ = fVar231;
                auVar270._12_4_ = fVar231;
                auVar130 = vfmadd213ps_fma(auVar270,auVar10,auVar155);
                auVar165 = vfmadd213ss_fma(local_a20._0_16_,SUB6416(ZEXT464(0xc0400000),0),auVar97);
                local_b40 = auVar99._0_4_;
                auVar108._0_4_ = fVar128 * local_b40;
                auVar108._4_4_ = fStack_aec * local_b40;
                auVar108._8_4_ = fStack_ae8 * local_b40;
                auVar108._12_4_ = fStack_ae4 * local_b40;
                auVar136._4_4_ = local_a40._0_4_;
                auVar136._0_4_ = local_a40._0_4_;
                auVar136._8_4_ = local_a40._0_4_;
                auVar136._12_4_ = local_a40._0_4_;
                auVar99 = vfmadd213ps_fma(auVar136,auVar11,auVar108);
                uVar95 = auVar98._0_4_;
                auVar164._4_4_ = uVar95;
                auVar164._0_4_ = uVar95;
                auVar164._8_4_ = uVar95;
                auVar164._12_4_ = uVar95;
                auVar99 = vfmadd213ps_fma(auVar164,auVar12,auVar99);
                auVar155 = vdpps_avx(auVar130,auVar130,0x7f);
                uVar95 = auVar165._0_4_;
                auVar137._4_4_ = uVar95;
                auVar137._0_4_ = uVar95;
                auVar137._8_4_ = uVar95;
                auVar137._12_4_ = uVar95;
                auVar165 = vfmadd213ps_fma(auVar137,auVar10,auVar99);
                auVar99 = vblendps_avx(auVar155,_DAT_01f7aa10,0xe);
                auVar98 = vrsqrtss_avx(auVar99,auVar99);
                fVar241 = auVar155._0_4_;
                fVar231 = auVar98._0_4_;
                auVar98 = vdpps_avx(auVar130,auVar165,0x7f);
                fVar231 = fVar231 * 1.5 + fVar241 * -0.5 * fVar231 * fVar231 * fVar231;
                auVar138._0_4_ = auVar165._0_4_ * fVar241;
                auVar138._4_4_ = auVar165._4_4_ * fVar241;
                auVar138._8_4_ = auVar165._8_4_ * fVar241;
                auVar138._12_4_ = auVar165._12_4_ * fVar241;
                fVar240 = auVar98._0_4_;
                auVar216._0_4_ = auVar130._0_4_ * fVar240;
                auVar216._4_4_ = auVar130._4_4_ * fVar240;
                fVar242 = auVar130._8_4_;
                auVar216._8_4_ = fVar242 * fVar240;
                fVar244 = auVar130._12_4_;
                auVar216._12_4_ = fVar244 * fVar240;
                auVar98 = vsubps_avx(auVar138,auVar216);
                auVar99 = vrcpss_avx(auVar99,auVar99);
                auVar165 = vfnmadd213ss_fma(auVar99,auVar155,auVar97);
                fVar240 = auVar99._0_4_ * auVar165._0_4_;
                auVar99 = vmaxss_avx(ZEXT416((uint)fVar193),
                                     ZEXT416((uint)(fVar243 * (float)local_780._0_4_)));
                auVar283 = ZEXT1664(auVar99);
                auVar235._0_8_ = auVar130._0_8_ ^ 0x8000000080000000;
                auVar235._8_4_ = -fVar242;
                auVar235._12_4_ = -fVar244;
                auVar184._0_4_ = fVar231 * auVar98._0_4_ * fVar240;
                auVar184._4_4_ = fVar231 * auVar98._4_4_ * fVar240;
                auVar184._8_4_ = fVar231 * auVar98._8_4_ * fVar240;
                auVar184._12_4_ = fVar231 * auVar98._12_4_ * fVar240;
                auVar249._0_4_ = auVar130._0_4_ * fVar231;
                auVar249._4_4_ = auVar130._4_4_ * fVar231;
                auVar249._8_4_ = fVar242 * fVar231;
                auVar249._12_4_ = fVar244 * fVar231;
                local_a20._0_16_ = auVar130;
                local_a40._0_4_ = auVar99._0_4_;
                if (fVar241 < -fVar241) {
                  auVar290 = ZEXT1664(auVar129);
                  fVar231 = sqrtf(fVar241);
                  auVar283 = ZEXT464((uint)local_a40._0_4_);
                  auVar107 = ZEXT416(auVar107._0_4_);
                }
                else {
                  auVar99 = vsqrtss_avx(auVar155,auVar155);
                  fVar231 = auVar99._0_4_;
                }
                auVar259 = ZEXT1664(auVar249);
                auVar99 = vdpps_avx(_local_9e0,auVar249,0x7f);
                auVar165 = vfmadd213ss_fma(ZEXT416((uint)fVar193),auVar107,auVar283._0_16_);
                auVar155 = vdpps_avx(auVar235,auVar249,0x7f);
                auVar98 = vdpps_avx(_local_9e0,auVar184,0x7f);
                auVar130 = vdpps_avx(local_990,auVar249,0x7f);
                auVar165 = vfmadd213ss_fma(ZEXT416((uint)(auVar107._0_4_ + 1.0)),
                                           ZEXT416((uint)(fVar193 / fVar231)),auVar165);
                auVar274 = ZEXT1664(auVar165);
                fVar231 = auVar155._0_4_ + auVar98._0_4_;
                fVar241 = auVar99._0_4_;
                auVar109._0_4_ = fVar241 * fVar241;
                auVar109._4_4_ = auVar99._4_4_ * auVar99._4_4_;
                auVar109._8_4_ = auVar99._8_4_ * auVar99._8_4_;
                auVar109._12_4_ = auVar99._12_4_ * auVar99._12_4_;
                auVar155 = vdpps_avx(_local_9e0,auVar235,0x7f);
                auVar98 = vsubps_avx(auVar100,auVar109);
                auVar107 = vrsqrtss_avx(auVar98,auVar98);
                fVar242 = auVar98._0_4_;
                fVar240 = auVar107._0_4_;
                fVar240 = fVar240 * 1.5 + fVar242 * -0.5 * fVar240 * fVar240 * fVar240;
                auVar107 = vdpps_avx(_local_9e0,local_990,0x7f);
                auVar155 = vfnmadd231ss_fma(auVar155,auVar99,ZEXT416((uint)fVar231));
                auVar107 = vfnmadd231ss_fma(auVar107,auVar99,auVar130);
                if (fVar242 < 0.0) {
                  local_9c0._0_16_ = auVar130;
                  local_a80._0_4_ = fVar240;
                  local_7a0._0_16_ = auVar107;
                  auVar259 = ZEXT1664(auVar249);
                  auVar290 = ZEXT1664(auVar290._0_16_);
                  fVar242 = sqrtf(fVar242);
                  auVar274 = ZEXT464(auVar165._0_4_);
                  auVar283 = ZEXT464((uint)local_a40._0_4_);
                  fVar240 = (float)local_a80._0_4_;
                  auVar107 = local_7a0._0_16_;
                  auVar130 = local_9c0._0_16_;
                }
                else {
                  auVar98 = vsqrtss_avx(auVar98,auVar98);
                  fVar242 = auVar98._0_4_;
                }
                auVar239 = ZEXT1664(local_a20._0_16_);
                auVar98 = vpermilps_avx(local_760._0_16_,0xff);
                fVar242 = fVar242 - auVar98._0_4_;
                auVar98 = vshufps_avx(local_a20._0_16_,local_a20._0_16_,0xff);
                auVar155 = vfmsub213ss_fma(auVar155,ZEXT416((uint)fVar240),auVar98);
                auVar185._0_8_ = auVar130._0_8_ ^ 0x8000000080000000;
                auVar185._8_4_ = auVar130._8_4_ ^ 0x80000000;
                auVar185._12_4_ = auVar130._12_4_ ^ 0x80000000;
                auVar200._0_8_ = auVar155._0_8_ ^ 0x8000000080000000;
                auVar200._8_4_ = auVar155._8_4_ ^ 0x80000000;
                auVar200._12_4_ = auVar155._12_4_ ^ 0x80000000;
                auVar165 = ZEXT416((uint)(auVar107._0_4_ * fVar240));
                auVar107 = vfmsub231ss_fma(ZEXT416((uint)(auVar130._0_4_ * auVar155._0_4_)),
                                           ZEXT416((uint)fVar231),auVar165);
                auVar155 = vinsertps_avx(auVar200,auVar165,0x1c);
                uVar95 = auVar107._0_4_;
                auVar201._4_4_ = uVar95;
                auVar201._0_4_ = uVar95;
                auVar201._8_4_ = uVar95;
                auVar201._12_4_ = uVar95;
                auVar155 = vdivps_avx(auVar155,auVar201);
                auVar107 = vinsertps_avx(ZEXT416((uint)fVar231),auVar185,0x10);
                auVar107 = vdivps_avx(auVar107,auVar201);
                auVar166._0_4_ = fVar241 * auVar155._0_4_ + fVar242 * auVar107._0_4_;
                auVar166._4_4_ = fVar241 * auVar155._4_4_ + fVar242 * auVar107._4_4_;
                auVar166._8_4_ = fVar241 * auVar155._8_4_ + fVar242 * auVar107._8_4_;
                auVar166._12_4_ = fVar241 * auVar155._12_4_ + fVar242 * auVar107._12_4_;
                auVar155 = vsubps_avx(auVar266._0_16_,auVar166);
                auVar266 = ZEXT1664(auVar155);
                auVar99 = vandps_avx(auVar99,auVar232);
                if (auVar99._0_4_ < auVar274._0_4_) {
                  auVar107 = vfmadd231ss_fma(ZEXT416((uint)(auVar283._0_4_ + auVar274._0_4_)),
                                             local_7c0,ZEXT416(0x36000000));
                  auVar99 = vandps_avx(ZEXT416((uint)fVar242),auVar232);
                  if (auVar99._0_4_ < auVar107._0_4_) {
                    fVar231 = auVar155._0_4_ + (float)local_8f0._0_4_;
                    auVar99 = ZEXT416((uint)fVar231);
                    if ((fVar94 <= fVar231) &&
                       (fVar240 = *(float *)(ray + k * 4 + 0x80), fVar231 <= fVar240)) {
                      auVar107 = vmovshdup_avx(auVar155);
                      fVar241 = auVar107._0_4_;
                      if ((0.0 <= fVar241) && (fVar241 <= 1.0)) {
                        auVar100 = vrsqrtss_avx(auVar100,auVar100);
                        fVar242 = auVar100._0_4_;
                        pGVar4 = (context->scene->geometries).items[uVar85].ptr;
                        if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          fVar96 = fVar242 * 1.5 + fVar96 * -0.5 * fVar242 * fVar242 * fVar242;
                          auVar186._0_4_ = fVar96 * (float)local_9e0._0_4_;
                          auVar186._4_4_ = fVar96 * (float)local_9e0._4_4_;
                          auVar186._8_4_ = fVar96 * fStack_9d8;
                          auVar186._12_4_ = fVar96 * fStack_9d4;
                          auVar130 = vfmadd213ps_fma(auVar98,auVar186,local_a20._0_16_);
                          auVar100 = vshufps_avx(auVar186,auVar186,0xc9);
                          auVar107 = vshufps_avx(local_a20._0_16_,local_a20._0_16_,0xc9);
                          auVar187._0_4_ = auVar186._0_4_ * auVar107._0_4_;
                          auVar187._4_4_ = auVar186._4_4_ * auVar107._4_4_;
                          auVar187._8_4_ = auVar186._8_4_ * auVar107._8_4_;
                          auVar187._12_4_ = auVar186._12_4_ * auVar107._12_4_;
                          auVar98 = vfmsub231ps_fma(auVar187,local_a20._0_16_,auVar100);
                          auVar100 = vshufps_avx(auVar98,auVar98,0xc9);
                          auVar107 = vshufps_avx(auVar130,auVar130,0xc9);
                          auVar98 = vshufps_avx(auVar98,auVar98,0xd2);
                          auVar110._0_4_ = auVar130._0_4_ * auVar98._0_4_;
                          auVar110._4_4_ = auVar130._4_4_ * auVar98._4_4_;
                          auVar110._8_4_ = auVar130._8_4_ * auVar98._8_4_;
                          auVar110._12_4_ = auVar130._12_4_ * auVar98._12_4_;
                          auVar100 = vfmsub231ps_fma(auVar110,auVar100,auVar107);
                          uVar95 = auVar100._0_4_;
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar231;
                            uVar3 = vextractps_avx(auVar100,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar3;
                            uVar3 = vextractps_avx(auVar100,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar3;
                            *(undefined4 *)(ray + k * 4 + 0xe0) = uVar95;
                            *(float *)(ray + k * 4 + 0xf0) = fVar241;
                            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                            *(int *)(ray + k * 4 + 0x110) = (int)local_960;
                            *(uint *)(ray + k * 4 + 0x120) = uVar85;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            local_6f0 = vshufps_avx(auVar155,auVar155,0x55);
                            auVar107 = vshufps_avx(auVar100,auVar100,0x55);
                            auStack_710 = vshufps_avx(auVar100,auVar100,0xaa);
                            local_720 = (RTCHitN  [16])auVar107;
                            local_700 = uVar95;
                            uStack_6fc = uVar95;
                            uStack_6f8 = uVar95;
                            uStack_6f4 = uVar95;
                            local_6e0 = ZEXT416(0) << 0x20;
                            local_6d0 = CONCAT44(uStack_73c,local_740);
                            uStack_6c8 = CONCAT44(uStack_734,uStack_738);
                            local_6c0._4_4_ = uStack_72c;
                            local_6c0._0_4_ = local_730;
                            local_6c0._8_4_ = uStack_728;
                            local_6c0._12_4_ = uStack_724;
                            vpcmpeqd_avx2(ZEXT1632(local_6c0),ZEXT1632(local_6c0));
                            uStack_6ac = context->user->instID[0];
                            local_6b0 = uStack_6ac;
                            uStack_6a8 = uStack_6ac;
                            uStack_6a4 = uStack_6ac;
                            uStack_6a0 = context->user->instPrimID[0];
                            uStack_69c = uStack_6a0;
                            uStack_698 = uStack_6a0;
                            uStack_694 = uStack_6a0;
                            *(float *)(ray + k * 4 + 0x80) = fVar231;
                            local_8e0 = *local_9e8;
                            local_ab0.valid = (int *)local_8e0;
                            local_ab0.geometryUserPtr = pGVar4->userPtr;
                            local_ab0.context = context->user;
                            local_ab0.hit = local_720;
                            local_ab0.N = 4;
                            local_ab0.ray = (RTCRayN *)ray;
                            if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar239 = ZEXT1664(local_a20._0_16_);
                              auVar259 = ZEXT1664(auVar259._0_16_);
                              auVar266 = ZEXT1664(auVar155);
                              auVar274 = ZEXT1664(auVar274._0_16_);
                              auVar283 = ZEXT1664(auVar283._0_16_);
                              auVar290 = ZEXT1664(auVar290._0_16_);
                              (*pGVar4->intersectionFilterN)(&local_ab0);
                              auVar154._8_56_ = extraout_var_02;
                              auVar154._0_8_ = extraout_XMM1_Qa_00;
                              auVar99 = auVar154._0_16_;
                            }
                            if (local_8e0 == (undefined1  [16])0x0) {
                              auVar100 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar99 = vpcmpeqd_avx(auVar99,auVar99);
                              auVar100 = auVar100 ^ auVar99;
                            }
                            else {
                              p_Var5 = context->args->filter;
                              auVar99 = vpcmpeqd_avx(auVar107,auVar107);
                              if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar239 = ZEXT1664(auVar239._0_16_);
                                auVar259 = ZEXT1664(auVar259._0_16_);
                                auVar266 = ZEXT1664(auVar266._0_16_);
                                auVar274 = ZEXT1664(auVar274._0_16_);
                                auVar283 = ZEXT1664(auVar283._0_16_);
                                auVar290 = ZEXT1664(auVar290._0_16_);
                                (*p_Var5)(&local_ab0);
                                auVar99 = vpcmpeqd_avx(auVar99,auVar99);
                              }
                              auVar155 = vpcmpeqd_avx(local_8e0,_DAT_01f7aa10);
                              auVar100 = auVar155 ^ auVar99;
                              if (local_8e0 != (undefined1  [16])0x0) {
                                auVar155 = auVar155 ^ auVar99;
                                auVar99 = vmaskmovps_avx(auVar155,*(undefined1 (*) [16])
                                                                   local_ab0.hit);
                                *(undefined1 (*) [16])(local_ab0.ray + 0xc0) = auVar99;
                                auVar99 = vmaskmovps_avx(auVar155,*(undefined1 (*) [16])
                                                                   (local_ab0.hit + 0x10));
                                *(undefined1 (*) [16])(local_ab0.ray + 0xd0) = auVar99;
                                auVar99 = vmaskmovps_avx(auVar155,*(undefined1 (*) [16])
                                                                   (local_ab0.hit + 0x20));
                                *(undefined1 (*) [16])(local_ab0.ray + 0xe0) = auVar99;
                                auVar99 = vmaskmovps_avx(auVar155,*(undefined1 (*) [16])
                                                                   (local_ab0.hit + 0x30));
                                *(undefined1 (*) [16])(local_ab0.ray + 0xf0) = auVar99;
                                auVar99 = vmaskmovps_avx(auVar155,*(undefined1 (*) [16])
                                                                   (local_ab0.hit + 0x40));
                                *(undefined1 (*) [16])(local_ab0.ray + 0x100) = auVar99;
                                auVar99 = vmaskmovps_avx(auVar155,*(undefined1 (*) [16])
                                                                   (local_ab0.hit + 0x50));
                                *(undefined1 (*) [16])(local_ab0.ray + 0x110) = auVar99;
                                auVar99 = vmaskmovps_avx(auVar155,*(undefined1 (*) [16])
                                                                   (local_ab0.hit + 0x60));
                                *(undefined1 (*) [16])(local_ab0.ray + 0x120) = auVar99;
                                auVar99 = vmaskmovps_avx(auVar155,*(undefined1 (*) [16])
                                                                   (local_ab0.hit + 0x70));
                                *(undefined1 (*) [16])(local_ab0.ray + 0x130) = auVar99;
                                auVar99 = vmaskmovps_avx(auVar155,*(undefined1 (*) [16])
                                                                   (local_ab0.hit + 0x80));
                                *(undefined1 (*) [16])(local_ab0.ray + 0x140) = auVar99;
                              }
                            }
                            auVar111._8_8_ = 0x100000001;
                            auVar111._0_8_ = 0x100000001;
                            if ((auVar111 & auVar100) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar240;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar89 = lVar89 + -1;
              } while (lVar89 != 0);
              uVar95 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar122._4_4_ = uVar95;
              auVar122._0_4_ = uVar95;
              auVar122._8_4_ = uVar95;
              auVar122._12_4_ = uVar95;
              auVar122._16_4_ = uVar95;
              auVar122._20_4_ = uVar95;
              auVar122._24_4_ = uVar95;
              auVar122._28_4_ = uVar95;
              auVar147 = vcmpps_avx(_local_880,auVar122,2);
              auVar114 = vandps_avx(auVar147,local_920);
              auVar147 = local_920 & auVar147;
            } while ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar147 >> 0x7f,0) != '\0') ||
                       (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar147 >> 0xbf,0) != '\0') ||
                     (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar147[0x1f] < '\0');
            local_920 = auVar114;
          }
          auVar174._0_4_ = (float)local_940._0_4_ + local_3a0._0_4_;
          auVar174._4_4_ = (float)local_940._4_4_ + local_3a0._4_4_;
          auVar174._8_4_ = fStack_938 + local_3a0._8_4_;
          auVar174._12_4_ = fStack_934 + local_3a0._12_4_;
          auVar174._16_4_ = fStack_930 + local_3a0._16_4_;
          auVar174._20_4_ = fStack_92c + local_3a0._20_4_;
          auVar174._24_4_ = fStack_928 + local_3a0._24_4_;
          auVar174._28_4_ = fStack_924 + local_3a0._28_4_;
          auVar147 = vcmpps_avx(auVar174,auVar122,2);
          auVar114 = vandps_avx(local_600,local_5e0);
          auVar114 = vandps_avx(auVar147,auVar114);
          auVar192._0_4_ = (float)local_940._0_4_ + local_360._0_4_;
          auVar192._4_4_ = (float)local_940._4_4_ + local_360._4_4_;
          auVar192._8_4_ = fStack_938 + local_360._8_4_;
          auVar192._12_4_ = fStack_934 + local_360._12_4_;
          auVar192._16_4_ = fStack_930 + local_360._16_4_;
          auVar192._20_4_ = fStack_92c + local_360._20_4_;
          auVar192._24_4_ = fStack_928 + local_360._24_4_;
          auVar192._28_4_ = fStack_924 + local_360._28_4_;
          auVar280 = vcmpps_avx(auVar192,auVar122,2);
          auVar147 = vandps_avx(_local_8c0,local_8a0);
          auVar147 = vandps_avx(auVar280,auVar147);
          auVar147 = vorps_avx(auVar114,auVar147);
          if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar147 >> 0x7f,0) != '\0') ||
                (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar147 >> 0xbf,0) != '\0') ||
              (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar147[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar93 * 0x60) = auVar147;
            auVar114 = vblendvps_avx(local_360,local_3a0,auVar114);
            *(undefined1 (*) [32])(auStack_160 + uVar93 * 0x60) = auVar114;
            uVar1 = vmovlps_avx(local_570);
            (&uStack_140)[uVar93 * 0xc] = uVar1;
            aiStack_138[uVar93 * 0x18] = local_c08 + 1;
            iVar92 = iVar92 + 1;
          }
        }
      }
    }
    if (iVar92 == 0) break;
    uVar95 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar125._4_4_ = uVar95;
    auVar125._0_4_ = uVar95;
    auVar125._8_4_ = uVar95;
    auVar125._12_4_ = uVar95;
    auVar125._16_4_ = uVar95;
    auVar125._20_4_ = uVar95;
    auVar125._24_4_ = uVar95;
    auVar125._28_4_ = uVar95;
    uVar87 = -iVar92;
    pauVar86 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar92 - 1) * 0x60);
    fVar193 = (float)local_940._0_4_;
    fVar96 = (float)local_940._4_4_;
    fVar231 = fStack_938;
    fVar240 = fStack_934;
    fVar241 = fStack_930;
    fVar242 = fStack_92c;
    fVar243 = fStack_928;
    fVar244 = fStack_924;
    while( true ) {
      auVar114 = pauVar86[1];
      auVar148._0_4_ = fVar193 + auVar114._0_4_;
      auVar148._4_4_ = fVar96 + auVar114._4_4_;
      auVar148._8_4_ = fVar231 + auVar114._8_4_;
      auVar148._12_4_ = fVar240 + auVar114._12_4_;
      auVar148._16_4_ = fVar241 + auVar114._16_4_;
      auVar148._20_4_ = fVar242 + auVar114._20_4_;
      auVar148._24_4_ = fVar243 + auVar114._24_4_;
      auVar148._28_4_ = fVar244 + auVar114._28_4_;
      auVar280 = vcmpps_avx(auVar148,auVar125,2);
      auVar147 = vandps_avx(auVar280,*pauVar86);
      _local_720 = auVar147;
      auVar280 = *pauVar86 & auVar280;
      if ((((((((auVar280 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar280 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar280 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar280 >> 0x7f,0) != '\0') ||
            (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar280 >> 0xbf,0) != '\0') ||
          (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar280[0x1f] < '\0') break;
      pauVar86 = pauVar86 + -3;
      uVar87 = uVar87 + 1;
      fVar193 = (float)local_940._0_4_;
      fVar96 = (float)local_940._4_4_;
      fVar231 = fStack_938;
      fVar240 = fStack_934;
      fVar241 = fStack_930;
      fVar242 = fStack_92c;
      fVar243 = fStack_928;
      fVar244 = fStack_924;
      if (uVar87 == 0) goto LAB_0160a605;
    }
    auVar126._8_4_ = 0x7f800000;
    auVar126._0_8_ = 0x7f8000007f800000;
    auVar126._12_4_ = 0x7f800000;
    auVar126._16_4_ = 0x7f800000;
    auVar126._20_4_ = 0x7f800000;
    auVar126._24_4_ = 0x7f800000;
    auVar126._28_4_ = 0x7f800000;
    auVar114 = vblendvps_avx(auVar126,auVar114,auVar147);
    auVar280 = vshufps_avx(auVar114,auVar114,0xb1);
    auVar280 = vminps_avx(auVar114,auVar280);
    auVar13 = vshufpd_avx(auVar280,auVar280,5);
    auVar280 = vminps_avx(auVar280,auVar13);
    auVar13 = vpermpd_avx2(auVar280,0x4e);
    auVar280 = vminps_avx(auVar280,auVar13);
    auVar114 = vcmpps_avx(auVar114,auVar280,0);
    auVar280 = auVar147 & auVar114;
    if ((((((((auVar280 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar280 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar280 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar280 >> 0x7f,0) != '\0') ||
          (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar280 >> 0xbf,0) != '\0') ||
        (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar280[0x1f] < '\0') {
      auVar147 = vandps_avx(auVar114,auVar147);
    }
    uVar18 = *(ulong *)pauVar86[2];
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uVar18;
    uVar88 = vmovmskps_avx(auVar147);
    iVar92 = 0;
    for (; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000) {
      iVar92 = iVar92 + 1;
    }
    *(undefined4 *)(local_720 + (uint)(iVar92 << 2)) = 0;
    uVar88 = ~uVar87;
    if ((((((((_local_720 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_720 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_720 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_720 >> 0x7f,0) != '\0') ||
          (_local_720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_720 >> 0xbf,0) != '\0') ||
        (_local_720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_720[0x1f] < '\0') {
      uVar88 = -uVar87;
    }
    uVar93 = (ulong)uVar88;
    local_c08 = *(int *)(pauVar86[2] + 8);
    *pauVar86 = _local_720;
    uVar95 = (undefined4)uVar18;
    auVar149._4_4_ = uVar95;
    auVar149._0_4_ = uVar95;
    auVar149._8_4_ = uVar95;
    auVar149._12_4_ = uVar95;
    auVar149._16_4_ = uVar95;
    auVar149._20_4_ = uVar95;
    auVar149._24_4_ = uVar95;
    auVar149._28_4_ = uVar95;
    auVar100 = vmovshdup_avx(auVar112);
    auVar100 = vsubps_avx(auVar100,auVar112);
    auVar127._0_4_ = auVar100._0_4_;
    auVar127._4_4_ = auVar127._0_4_;
    auVar127._8_4_ = auVar127._0_4_;
    auVar127._12_4_ = auVar127._0_4_;
    auVar127._16_4_ = auVar127._0_4_;
    auVar127._20_4_ = auVar127._0_4_;
    auVar127._24_4_ = auVar127._0_4_;
    auVar127._28_4_ = auVar127._0_4_;
    auVar100 = vfmadd132ps_fma(auVar127,auVar149,_DAT_01faff20);
    local_3a0 = ZEXT1632(auVar100);
    auVar229 = ZEXT864(*(ulong *)(local_3a0 + (uint)(iVar92 << 2)));
  } while( true );
LAB_0160a605:
  uVar95 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar113._4_4_ = uVar95;
  auVar113._0_4_ = uVar95;
  auVar113._8_4_ = uVar95;
  auVar113._12_4_ = uVar95;
  auVar6 = vcmpps_avx(local_580,auVar113,2);
  uVar85 = vmovmskps_avx(auVar6);
  uVar85 = (uint)uVar91 & uVar85;
  if (uVar85 == 0) {
    return;
  }
  goto LAB_01607b3e;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }